

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O0

void __thiscall
amrex::FaceDivFree::interp_arr
          (FaceDivFree *this,Array<FArrayBox_*,_3> *crse,int crse_comp,Array<FArrayBox_*,_3> *fine,
          int fine_comp,int ncomp,Box *fine_region,IntVect *ratio,Array<IArrayBox_*,_3> *solve_mask,
          Geometry *param_10,Geometry *fine_geom,
          Vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
          *param_12,int param_13,int param_14,RunOn runon)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  undefined1 auVar5 [8];
  long lVar6;
  undefined1 auVar7 [8];
  long lVar8;
  undefined1 auVar9 [8];
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  bool bVar16;
  const_reference ppFVar17;
  const_reference ppIVar18;
  byte bVar19;
  int iVar20;
  long lVar21;
  int in_EDX;
  int in_R8D;
  int in_R9D;
  long *in_stack_00000008;
  int *in_stack_00000010;
  CoordSys *in_stack_00000028;
  int n_2;
  int i_2;
  int j_2;
  int k_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  int n_1;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int n;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box bx2;
  Box bx1;
  Box bx0;
  int d_1;
  GpuArray<amrex::Array4<const_int>,_3U> maskarr;
  GpuArray<amrex::Array4<double>,_3U> finearr;
  GpuArray<amrex::Array4<const_double>,_3U> crsearr;
  GpuArray<double,_3U> cell_size;
  Box c_fine_region;
  int d;
  Array<IndexType,_3> types;
  Real ru_8;
  Real cu_8;
  Real lu_8;
  Real rc_8;
  Real cc_8;
  Real lc_8;
  Real rl_8;
  Real cl_8;
  Real ll_8;
  Real ru_7;
  Real cu_7;
  Real lu_7;
  Real rc_7;
  Real cc_7;
  Real lc_7;
  Real rl_7;
  Real cl_7;
  Real ll_7;
  Real ru_6;
  Real cu_6;
  Real lu_6;
  Real rc_6;
  Real cc_6;
  Real lc_6;
  Real rl_6;
  Real cl_6;
  Real ll_6;
  int fk_2;
  int fj_2;
  int fi_2;
  Real ru_5;
  Real cu_5;
  Real lu_5;
  Real rc_5;
  Real cc_5;
  Real lc_5;
  Real rl_5;
  Real cl_5;
  Real ll_5;
  Real ru_4;
  Real cu_4;
  Real lu_4;
  Real rc_4;
  Real cc_4;
  Real lc_4;
  Real rl_4;
  Real cl_4;
  Real ll_4;
  Real ru_3;
  Real cu_3;
  Real lu_3;
  Real rc_3;
  Real cc_3;
  Real lc_3;
  Real rl_3;
  Real cl_3;
  Real ll_3;
  int fk_1;
  int fj_1;
  int fi_1;
  Real ru_2;
  Real cu_2;
  Real lu_2;
  Real rc_2;
  Real cc_2;
  Real lc_2;
  Real rl_2;
  Real cl_2;
  Real ll_2;
  Real ru_1;
  Real cu_1;
  Real lu_1;
  Real rc_1;
  Real cc_1;
  Real lc_1;
  Real rl_1;
  Real cl_1;
  Real ll_1;
  Real ru;
  Real cu;
  Real lu;
  Real rc;
  Real cc;
  Real lc;
  Real rl;
  Real cl;
  Real ll;
  int fk;
  int fj;
  int fi;
  int dir;
  IntVect off;
  int off_1;
  uint bitval;
  uint typ;
  int dir_1;
  int off_2;
  uint bitval_1;
  uint typ_1;
  int dir_2;
  int off_3;
  uint bitval_2;
  uint typ_2;
  int dir_3;
  undefined4 in_stack_ffffffffffffdf78;
  undefined4 in_stack_ffffffffffffdf7c;
  undefined4 in_stack_ffffffffffffdf80;
  undefined4 in_stack_ffffffffffffdf84;
  GpuArray<amrex::Array4<double>,_3U> *in_stack_ffffffffffffdf90;
  int local_203c;
  int in_stack_ffffffffffffdfc8;
  int in_stack_ffffffffffffdfcc;
  int in_stack_ffffffffffffdfd4;
  int in_stack_ffffffffffffdfd8;
  int in_stack_ffffffffffffdfdc;
  int local_201c;
  int local_2018;
  int local_2014;
  int local_2004;
  int local_2000;
  int local_1ffc;
  int local_1ff4;
  int local_1ff0;
  int local_1fec;
  int local_1fe4;
  int local_1fe0;
  int local_1fdc;
  int local_1fcc;
  int local_1fc8;
  int local_1fc4;
  int local_1fbc;
  int local_1fb8;
  int local_1fb4;
  int local_1fac;
  int local_1fa8;
  int local_1fa4;
  bool local_1f79;
  bool local_1f69;
  undefined1 auStack_1f60 [192];
  undefined8 local_1ea0;
  int local_1e98;
  double local_1e90;
  double local_1e88;
  double local_1e80;
  int local_1e78;
  int local_1e74;
  long local_1e70;
  char *in_stack_ffffffffffffe198;
  int in_stack_ffffffffffffe1a4;
  undefined4 in_stack_ffffffffffffe1a8;
  undefined4 in_stack_ffffffffffffe1ac;
  undefined4 in_stack_ffffffffffffe1b0;
  undefined4 in_stack_ffffffffffffe1b4;
  undefined1 auVar22 [8];
  int local_1e28;
  int local_1e24;
  undefined1 local_1e20 [72];
  int local_1dd8;
  int local_1dd4;
  undefined1 local_1dd0 [68];
  undefined1 local_1d8c [8];
  undefined8 local_1d84;
  undefined1 local_1d7c [8];
  uint local_1d74;
  undefined1 local_1d70 [8];
  undefined8 local_1d68;
  undefined1 local_1d60 [8];
  uint local_1d58;
  undefined1 local_1d54 [8];
  undefined8 local_1d4c;
  undefined1 local_1d44 [8];
  uint local_1d3c;
  Array4<const_int> local_1d38;
  Array4<double> local_1cf8;
  Array4<const_double> local_1cb8;
  int local_1c74;
  Array4 local_1c70 [64];
  Array4 local_1c30 [64];
  Array4 local_1bf0 [64];
  long local_1bb0 [8];
  long local_1b70 [8];
  long local_1b30 [8];
  long local_1af0;
  Long aLStack_1ae8 [4];
  undefined1 auStack_1ac8 [24];
  long local_1ab0 [8];
  long local_1a70 [8];
  GpuArray<double,_3U> local_1a30;
  undefined8 local_1a14;
  undefined8 local_1a0c;
  undefined8 local_1a04;
  uint local_19fc;
  int local_19f8;
  int local_19e8;
  int local_19e4;
  int local_19d4;
  undefined1 *local_19b0;
  undefined1 *local_19a8;
  Array4<double> local_19a0;
  int local_195c;
  value_type local_1958;
  Array4<const_double> local_1950;
  int local_190c;
  value_type local_1908;
  int local_18fc;
  reference local_18f8;
  undefined4 local_18ec;
  long *local_18e8;
  undefined4 local_18dc;
  long *local_18d8;
  undefined4 local_18cc;
  long *local_18c8;
  int local_18bc;
  long *local_18b8;
  undefined4 local_18ac;
  long *local_18a8;
  undefined4 local_189c;
  long *local_1898;
  undefined4 local_188c;
  long *local_1888;
  int local_187c;
  long *local_1878;
  Array4<const_int> local_1870;
  int local_182c;
  value_type local_1828;
  undefined4 local_181c;
  Array4 *local_1818;
  undefined4 local_180c;
  Array4 *local_1808;
  undefined4 local_17fc;
  Array4 *local_17f8;
  int local_17ec;
  Array4 *local_17e8;
  uint local_17dc;
  reference local_17d8;
  undefined8 *local_17d0;
  uint local_17c4;
  reference local_17c0;
  undefined8 *local_17b8;
  uint local_17ac;
  reference local_17a8;
  undefined8 *local_17a0;
  int local_1798;
  undefined1 auStack_1794 [12];
  undefined1 *local_1788;
  int local_177c;
  undefined1 auStack_1778 [8];
  int local_1770;
  undefined1 auStack_176c [12];
  undefined1 *local_1760;
  int local_1754;
  undefined1 auStack_1750 [8];
  int local_1748;
  undefined1 auStack_1744 [12];
  undefined1 *local_1738;
  int local_172c;
  undefined1 auStack_1728 [8];
  undefined8 local_1720;
  long local_1718;
  undefined1 *local_1710;
  int local_1704;
  undefined1 auStack_1700 [8];
  undefined8 local_16f8;
  long local_16f0;
  undefined1 *local_16e8;
  int local_16dc;
  undefined1 auStack_16d8 [8];
  undefined8 local_16d0;
  long local_16c8;
  undefined1 *local_16c0;
  int local_16b8;
  undefined1 auStack_16b4 [8];
  undefined4 local_16ac;
  long local_16a8;
  undefined4 local_169c;
  long local_1698;
  undefined4 local_168c;
  long local_1688;
  undefined4 local_167c;
  long local_1678;
  undefined4 local_166c;
  long local_1668;
  undefined4 local_165c;
  long local_1658;
  undefined4 local_164c;
  long local_1648;
  undefined4 local_163c;
  long local_1638;
  undefined4 local_162c;
  long local_1628;
  undefined4 local_161c;
  undefined1 *local_1618;
  undefined4 local_160c;
  undefined1 *local_1608;
  undefined4 local_15fc;
  undefined1 *local_15f8;
  undefined4 local_15ec;
  undefined1 *local_15e8;
  undefined4 local_15dc;
  undefined1 *local_15d8;
  undefined4 local_15cc;
  undefined1 *local_15c8;
  undefined4 local_15bc;
  undefined1 *local_15b8;
  undefined4 local_15ac;
  undefined1 *local_15a8;
  undefined4 local_159c;
  undefined1 *local_1598;
  undefined4 local_158c;
  undefined8 local_1580;
  undefined4 local_1574;
  char *local_1570;
  char *local_1568;
  double local_1560;
  double local_1558;
  double local_1550;
  double local_1548;
  double local_1540;
  double local_1538;
  double local_1530;
  double local_1528;
  double local_1520;
  double local_1518;
  double local_1510;
  double local_1508;
  double local_1500;
  double local_14f8;
  double local_14f0;
  double local_14e8;
  double local_14e0;
  double local_14d8;
  double local_14d0;
  double local_14c8;
  double local_14c0;
  double local_14b8;
  double local_14b0;
  double local_14a8;
  double local_14a0;
  double local_1498;
  double local_1490;
  int local_1484;
  int local_1480;
  int local_147c;
  int *local_1478;
  Array4 *local_1470;
  long *local_1468;
  long *local_1460;
  int local_1454;
  int local_1450;
  int local_144c;
  undefined1 local_1448 [8];
  int local_1440;
  undefined4 local_143c;
  int *local_1438;
  undefined4 local_142c;
  int *local_1428;
  undefined4 local_141c;
  int *local_1418;
  double local_1410;
  double local_1408;
  double local_1400;
  double local_13f8;
  double local_13f0;
  double local_13e8;
  double local_13e0;
  double local_13d8;
  double local_13d0;
  double local_13c8;
  double local_13c0;
  double local_13b8;
  double local_13b0;
  double local_13a8;
  double local_13a0;
  double local_1398;
  double local_1390;
  double local_1388;
  double local_1380;
  double local_1378;
  double local_1370;
  double local_1368;
  double local_1360;
  double local_1358;
  double local_1350;
  double local_1348;
  double local_1340;
  int local_1334;
  int local_1330;
  int local_132c;
  int *local_1328;
  Array4 *local_1320;
  long *local_1318;
  long *local_1310;
  int local_1304;
  int local_1300;
  int local_12fc;
  undefined1 local_12f8 [8];
  int local_12f0;
  undefined4 local_12ec;
  int *local_12e8;
  undefined4 local_12dc;
  int *local_12d8;
  undefined4 local_12cc;
  int *local_12c8;
  double local_12c0;
  double local_12b8;
  double local_12b0;
  double local_12a8;
  double local_12a0;
  double local_1298;
  double local_1290;
  double local_1288;
  double local_1280;
  double local_1278;
  double local_1270;
  double local_1268;
  double local_1260;
  double local_1258;
  double local_1250;
  double local_1248;
  double local_1240;
  double local_1238;
  double local_1230;
  double local_1228;
  double local_1220;
  double local_1218;
  double local_1210;
  double local_1208;
  double local_1200;
  double local_11f8;
  double local_11f0;
  int local_11e4;
  int local_11e0;
  int local_11dc;
  int *local_11d8;
  Array4 *local_11d0;
  long *local_11c8;
  long *local_11c0;
  int local_11b4;
  int local_11b0;
  int local_11ac;
  undefined1 local_11a8 [8];
  int local_11a0;
  undefined4 local_119c;
  int *local_1198;
  undefined4 local_118c;
  int *local_1188;
  undefined4 local_117c;
  int *local_1178;
  int local_1170;
  IntVect local_116c;
  int *local_1160;
  undefined8 *local_1158;
  int local_114c;
  int *local_1148;
  undefined4 local_113c;
  int *local_1130;
  long local_1128;
  long local_1118;
  undefined8 *local_1108;
  uint *local_1100;
  int local_10f4;
  uint *local_10f0;
  int local_10e4;
  long local_10e0;
  undefined4 local_10d8;
  int local_10d4;
  IntVect *local_10d0;
  IntVect *local_10c8;
  long local_10c0;
  undefined4 local_10b4;
  IntVect *local_10b0;
  undefined4 local_10a4;
  IntVect *local_10a0;
  undefined4 local_1094;
  IntVect *local_1090;
  int local_1088;
  int local_1084;
  int local_1080;
  int local_107c;
  int local_1078;
  int local_1074;
  int local_1070;
  int local_106c;
  int local_1068;
  int local_1064;
  int local_1060;
  int local_105c;
  int local_1058;
  int local_1054;
  int local_1050;
  int local_104c;
  int local_1048;
  int local_1044;
  int local_1040;
  int local_103c;
  int local_1038;
  int local_1034;
  int local_1030;
  int local_102c;
  int local_1028;
  int local_1024;
  int local_1020;
  int local_101c;
  uint *local_1018;
  int local_1010;
  int local_100c;
  int local_1008;
  uint local_1004;
  uint local_1000;
  int local_ffc;
  undefined1 *local_ff8;
  uint local_ff0;
  int local_fec;
  uint *local_fe8;
  int local_fdc;
  uint *local_fd8;
  int local_fcc;
  uint *local_fc8;
  int local_fbc;
  uint *local_fb8;
  int local_fb0;
  int local_fac;
  int local_fa8;
  int local_fa4;
  long local_fa0;
  int local_f98;
  uint local_f94;
  uint local_f90;
  int local_f8c;
  undefined1 *local_f88;
  uint local_f80;
  int local_f7c;
  uint *local_f78;
  int local_f6c;
  uint *local_f68;
  int local_f5c;
  uint *local_f58;
  int local_f4c;
  uint *local_f48;
  int local_f40;
  int local_f3c;
  int local_f38;
  int local_f34;
  long local_f30;
  int local_f28;
  uint local_f24;
  uint local_f20;
  int local_f1c;
  undefined1 *local_f18;
  uint local_f10;
  int local_f0c;
  uint *local_f08;
  int local_efc;
  uint *local_ef8;
  int local_eec;
  uint *local_ee8;
  int local_edc;
  uint *local_ed8;
  int local_ed0;
  int local_ecc;
  int local_ec8;
  int local_ec4;
  long local_ec0;
  uint local_eb8;
  int local_eb4;
  uint *local_eb0;
  int local_ea4;
  uint *local_ea0;
  int local_e94;
  uint local_e90;
  int local_e8c;
  uint *local_e88;
  int local_e7c;
  uint *local_e78;
  int local_e6c;
  uint local_e68;
  int local_e64;
  uint *local_e60;
  int local_e54;
  uint *local_e50;
  int local_e48;
  int local_e44;
  uint *local_e40;
  int local_e38;
  int local_e34;
  uint *local_e30;
  int local_e28;
  int local_e24;
  uint *local_e20;
  int local_e14;
  int local_e10;
  int local_e0c;
  int local_e08;
  int local_e04;
  long *local_e00;
  int local_df8;
  int local_df4;
  int local_df0;
  int local_dec;
  long *local_de8;
  int local_de0;
  int local_ddc;
  int local_dd8;
  int local_dd4;
  long *local_dd0;
  int local_dc8;
  int local_dc4;
  int local_dc0;
  int local_dbc;
  long *local_db8;
  int local_db0;
  int local_dac;
  int local_da8;
  int local_da4;
  long *local_da0;
  int local_d98;
  int local_d94;
  int local_d90;
  int local_d8c;
  long *local_d88;
  int local_d80;
  int local_d7c;
  int local_d78;
  int local_d74;
  long *local_d70;
  int local_d68;
  int local_d64;
  int local_d60;
  int local_d5c;
  long *local_d58;
  int local_d50;
  int local_d4c;
  int local_d48;
  int local_d44;
  long *local_d40;
  int local_d38;
  int local_d34;
  int local_d30;
  int local_d2c;
  long *local_d28;
  int local_d20;
  int local_d1c;
  int local_d18;
  int local_d14;
  long *local_d10;
  int local_d08;
  int local_d04;
  int local_d00;
  int local_cfc;
  long *local_cf8;
  int local_cf0;
  int local_cec;
  int local_ce8;
  int local_ce4;
  long *local_ce0;
  int local_cd8;
  int local_cd4;
  int local_cd0;
  int local_ccc;
  long *local_cc8;
  int local_cc0;
  int local_cbc;
  int local_cb8;
  int local_cb4;
  long *local_cb0;
  int local_ca8;
  int local_ca4;
  int local_ca0;
  int local_c9c;
  long *local_c98;
  int local_c90;
  int local_c8c;
  int local_c88;
  int local_c84;
  long *local_c80;
  int local_c78;
  int local_c74;
  int local_c70;
  int local_c6c;
  long *local_c68;
  int local_c60;
  int local_c5c;
  int local_c58;
  int local_c54;
  long *local_c50;
  int local_c48;
  int local_c44;
  int local_c40;
  int local_c3c;
  long *local_c38;
  int local_c30;
  int local_c2c;
  int local_c28;
  int local_c24;
  long *local_c20;
  int local_c18;
  int local_c14;
  int local_c10;
  int local_c0c;
  long *local_c08;
  int local_c00;
  int local_bfc;
  int local_bf8;
  int local_bf4;
  long *local_bf0;
  int local_be8;
  int local_be4;
  int local_be0;
  int local_bdc;
  long *local_bd8;
  int local_bd0;
  int local_bcc;
  int local_bc8;
  int local_bc4;
  long *local_bc0;
  int local_bb8;
  int local_bb4;
  int local_bb0;
  int local_bac;
  long *local_ba8;
  int local_ba0;
  int local_b9c;
  int local_b98;
  int local_b94;
  long *local_b90;
  int local_b88;
  int local_b84;
  int local_b80;
  int local_b7c;
  long *local_b78;
  int local_b70;
  int local_b6c;
  int local_b68;
  int local_b64;
  long *local_b60;
  int local_b58;
  int local_b54;
  int local_b50;
  int local_b4c;
  long *local_b48;
  int local_b40;
  int local_b3c;
  int local_b38;
  int local_b34;
  long *local_b30;
  int local_b28;
  int local_b24;
  int local_b20;
  int local_b1c;
  long *local_b18;
  int local_b10;
  int local_b0c;
  int local_b08;
  int local_b04;
  long *local_b00;
  int local_af8;
  int local_af4;
  int local_af0;
  int local_aec;
  long *local_ae8;
  int local_ae0;
  int local_adc;
  int local_ad8;
  int local_ad4;
  long *local_ad0;
  int local_ac8;
  int local_ac4;
  int local_ac0;
  int local_abc;
  long *local_ab8;
  int local_ab0;
  int local_aac;
  int local_aa8;
  int local_aa4;
  long *local_aa0;
  int local_a98;
  undefined8 local_a94;
  int local_a8c;
  long *local_a88;
  int local_a80;
  int local_a7c;
  int local_a78;
  int local_a74;
  long *local_a70;
  int local_a68;
  int local_a64;
  undefined8 local_a60;
  long *local_a58;
  int local_a50;
  undefined1 local_a4c [8];
  int local_a44;
  long *local_a40;
  int local_a38;
  int local_a34;
  undefined8 local_a30;
  long *local_a28;
  int local_a20;
  int local_a1c;
  int local_a18;
  int local_a14;
  long *local_a10;
  int local_a08;
  undefined8 local_a04;
  int local_9fc;
  long *local_9f8;
  int local_9f0;
  int local_9ec;
  int local_9e8;
  int local_9e4;
  long *local_9e0;
  int local_9d8;
  int local_9d4;
  undefined8 local_9d0;
  long *local_9c8;
  int local_9c0;
  int local_9bc;
  undefined8 local_9b8;
  long *local_9b0;
  int local_9a8;
  int local_9a4;
  undefined8 local_9a0;
  long *local_998;
  int local_990;
  undefined1 local_98c [8];
  int local_984;
  long *local_980;
  int local_978;
  undefined1 local_974 [8];
  int local_96c;
  long *local_968;
  int local_960;
  undefined1 local_95c [8];
  int local_954;
  long *local_950;
  int local_948;
  int local_944;
  undefined8 local_940;
  long *local_938;
  int local_930;
  int local_92c;
  undefined8 local_928;
  long *local_920;
  int local_918;
  int local_914;
  undefined8 local_910;
  long *local_908;
  int local_900;
  undefined8 local_8fc;
  int local_8f4;
  long *local_8f0;
  int local_8e8;
  undefined8 local_8e4;
  int local_8dc;
  long *local_8d8;
  int local_8d0;
  undefined8 local_8cc;
  int local_8c4;
  long *local_8c0;
  int local_8b8;
  undefined1 local_8b4 [8];
  int local_8ac;
  long *local_8a8;
  int local_8a0;
  undefined1 local_89c [8];
  int local_894;
  long *local_890;
  int local_888;
  undefined1 local_884 [8];
  int local_87c;
  long *local_878;
  int local_870;
  undefined8 local_86c;
  int local_864;
  long *local_860;
  int local_858;
  undefined8 local_854;
  int local_84c;
  long *local_848;
  int local_840;
  undefined8 local_83c;
  int local_834;
  long *local_830;
  int local_828;
  int local_824;
  int local_820;
  int local_81c;
  long *local_818;
  int local_810;
  undefined8 local_80c;
  int local_804;
  long *local_800;
  int local_7f8;
  int local_7f4;
  int local_7f0;
  int local_7ec;
  long *local_7e8;
  int local_7e0;
  int local_7dc;
  undefined8 local_7d8;
  long *local_7d0;
  int local_7c8;
  undefined1 local_7c4 [8];
  int local_7bc;
  long *local_7b8;
  int local_7b0;
  int local_7ac;
  undefined8 local_7a8;
  long *local_7a0;
  int local_798;
  int local_794;
  int local_790;
  int local_78c;
  long *local_788;
  int local_780;
  undefined8 local_77c;
  int local_774;
  long *local_770;
  int local_768;
  int local_764;
  int local_760;
  int local_75c;
  long *local_758;
  int local_750;
  int local_74c;
  undefined8 local_748;
  long *local_740;
  int local_738;
  int local_734;
  undefined8 local_730;
  long *local_728;
  int local_720;
  int local_71c;
  undefined8 local_718;
  long *local_710;
  int local_708;
  undefined1 local_704 [8];
  int local_6fc;
  long *local_6f8;
  int local_6f0;
  undefined1 local_6ec [8];
  int local_6e4;
  long *local_6e0;
  int local_6d8;
  undefined1 local_6d4 [8];
  int local_6cc;
  long *local_6c8;
  int local_6c0;
  int local_6bc;
  undefined8 local_6b8;
  long *local_6b0;
  int local_6a8;
  int local_6a4;
  undefined8 local_6a0;
  long *local_698;
  int local_690;
  int local_68c;
  undefined8 local_688;
  long *local_680;
  int local_678;
  undefined8 local_674;
  int local_66c;
  long *local_668;
  int local_660;
  undefined8 local_65c;
  int local_654;
  long *local_650;
  int local_648;
  undefined8 local_644;
  int local_63c;
  long *local_638;
  int local_630;
  undefined1 local_62c [8];
  int local_624;
  long *local_620;
  int local_618;
  undefined1 local_614 [8];
  int local_60c;
  long *local_608;
  int local_600;
  undefined1 local_5fc [8];
  int local_5f4;
  long *local_5f0;
  int local_5e8;
  undefined8 local_5e4;
  int local_5dc;
  long *local_5d8;
  int local_5d0;
  undefined8 local_5cc;
  int local_5c4;
  long *local_5c0;
  int local_5b8;
  undefined8 local_5b4;
  int local_5ac;
  long *local_5a8;
  int local_5a0;
  int local_59c;
  int local_598;
  int local_594;
  long *local_590;
  int local_588;
  undefined8 local_584;
  int local_57c;
  long *local_578;
  int local_570;
  int local_56c;
  int local_568;
  int local_564;
  long *local_560;
  int local_558;
  int local_554;
  undefined8 local_550;
  long *local_548;
  int local_540;
  undefined1 local_53c [8];
  int local_534;
  long *local_530;
  int local_528;
  int local_524;
  undefined8 local_520;
  long *local_518;
  int local_510;
  int local_50c;
  int local_508;
  int local_504;
  long *local_500;
  int local_4f8;
  undefined8 local_4f4;
  int local_4ec;
  long *local_4e8;
  int local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  long *local_4d0;
  int local_4c8;
  int local_4c4;
  undefined8 local_4c0;
  long *local_4b8;
  int local_4b0;
  int local_4ac;
  undefined8 local_4a8;
  long *local_4a0;
  int local_498;
  int local_494;
  undefined8 local_490;
  long *local_488;
  int local_480;
  undefined1 local_47c [8];
  int local_474;
  long *local_470;
  int local_468;
  undefined1 local_464 [8];
  int local_45c;
  long *local_458;
  int local_450;
  undefined1 local_44c [8];
  int local_444;
  long *local_440;
  int local_438;
  int local_434;
  undefined8 local_430;
  long *local_428;
  int local_420;
  int local_41c;
  undefined8 local_418;
  long *local_410;
  int local_408;
  int local_404;
  undefined8 local_400;
  long *local_3f8;
  int local_3f0;
  undefined8 local_3ec;
  int local_3e4;
  long *local_3e0;
  int local_3d8;
  undefined8 local_3d4;
  int local_3cc;
  long *local_3c8;
  int local_3c0;
  undefined8 local_3bc;
  int local_3b4;
  long *local_3b0;
  int local_3a8;
  undefined1 local_3a4 [8];
  int local_39c;
  long *local_398;
  int local_390;
  undefined1 local_38c [8];
  int local_384;
  long *local_380;
  int local_378;
  undefined1 local_374 [8];
  int local_36c;
  long *local_368;
  int local_360;
  undefined8 local_35c;
  int local_354;
  long *local_350;
  int local_348;
  undefined8 local_344;
  int local_33c;
  long *local_338;
  int local_330;
  undefined8 local_32c;
  int local_324;
  long *local_320;
  Dim3 local_318;
  Dim3 local_308;
  Dim3 local_2f8;
  Dim3 local_2e8;
  int local_2dc;
  Box *local_2d8;
  double *local_2d0;
  Dim3 local_2c8;
  Box *local_2b8;
  int local_2b0;
  int iStack_2ac;
  int local_2a8;
  undefined4 local_2a4;
  Box *local_2a0;
  undefined4 local_294;
  Box *local_290;
  undefined4 local_284;
  Box *local_280;
  Dim3 local_278;
  Box *local_268;
  int local_260;
  int iStack_25c;
  int local_258;
  undefined4 local_254;
  IntVect *local_250;
  undefined4 local_244;
  IntVect *local_240;
  undefined4 local_234;
  IntVect *local_230;
  Dim3 local_228;
  Dim3 local_214;
  Dim3 local_208;
  Dim3 local_1f8;
  int local_1ec;
  Box *local_1e8;
  double *local_1e0;
  Dim3 local_1d8;
  Box *local_1c8;
  int local_1c0;
  int iStack_1bc;
  int local_1b8;
  undefined4 local_1b4;
  Box *local_1b0;
  undefined4 local_1a4;
  Box *local_1a0;
  undefined4 local_194;
  Box *local_190;
  Dim3 local_188;
  Box *local_178;
  int local_170;
  int iStack_16c;
  int local_168;
  undefined4 local_164;
  IntVect *local_160;
  undefined4 local_154;
  IntVect *local_150;
  undefined4 local_144;
  IntVect *local_140;
  Dim3 local_138;
  Dim3 local_124;
  Dim3 local_118;
  Dim3 local_108;
  int local_fc;
  Box *local_f8;
  int *local_f0;
  Dim3 local_e8;
  Box *local_d8;
  int local_d0;
  int iStack_cc;
  int local_c8;
  undefined4 local_c4;
  Box *local_c0;
  undefined4 local_b4;
  Box *local_b0;
  undefined4 local_a4;
  Box *local_a0;
  Dim3 local_98;
  Box *local_88;
  int local_80;
  int iStack_7c;
  int local_78;
  undefined4 local_74;
  IntVect *local_70;
  undefined4 local_64;
  IntVect *local_60;
  undefined4 local_54;
  IntVect *local_50;
  int local_48;
  undefined1 local_44 [8];
  int local_3c;
  Array4 *local_38;
  int local_30;
  undefined1 local_2c [8];
  int local_24;
  Array4 *local_20;
  int local_18;
  undefined1 local_14 [8];
  int local_c;
  Array4 *local_8;
  
  local_19e8 = in_R9D;
  local_19e4 = in_R8D;
  local_19d4 = in_EDX;
  std::array<amrex::IndexType,_3UL>::array
            ((array<amrex::IndexType,_3UL> *)in_stack_ffffffffffffdf90);
  for (local_19f8 = 0; local_19f8 < 3; local_19f8 = local_19f8 + 1) {
    local_18f8 = std::array<amrex::IndexType,_3UL>::operator[]
                           ((array<amrex::IndexType,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80),
                            CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78));
    local_18fc = local_19f8;
    local_100c = local_19f8;
    local_18f8->itype = 1 << ((byte)local_19f8 & 0x1f) | local_18f8->itype;
  }
  local_158c = 2;
  local_1f69 = false;
  if ((*in_stack_00000010 == 2) && (local_1f69 = false, in_stack_00000010[1] == 2)) {
    local_1f69 = in_stack_00000010[2] == 2;
  }
  if (!local_1f69) {
    local_1568 = "ratio == 2";
    local_1570 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/AmrCore/AMReX_Interpolater.cpp"
    ;
    local_1574 = 0x3a5;
    local_1580 = 0;
    Assert_host((char *)CONCAT44(in_stack_ffffffffffffe1b4,in_stack_ffffffffffffe1b0),
                (char *)CONCAT44(in_stack_ffffffffffffe1ac,in_stack_ffffffffffffe1a8),
                in_stack_ffffffffffffe1a4,in_stack_ffffffffffffe198);
  }
  lVar21 = *in_stack_00000008;
  unique0x00012000 = in_stack_00000008[1];
  lVar3 = in_stack_00000008[2];
  local_19fc = *(uint *)(in_stack_00000008 + 3);
  local_1158 = &local_1a14;
  local_1160 = in_stack_00000010;
  local_113c = 1;
  local_1f79 = true;
  if ((*in_stack_00000010 == 1) && (local_1f79 = true, in_stack_00000010[1] == 1)) {
    local_1f79 = in_stack_00000010[2] != 1;
  }
  local_1a14 = lVar21;
  local_1a0c = unique0x00012000;
  local_1a04 = lVar3;
  if (local_1f79) {
    local_1a14._0_4_ = (int)lVar21;
    local_106c = (int)local_1a14;
    local_1070 = *in_stack_00000010;
    local_1068 = local_106c;
    if (local_1070 != 1) {
      if (local_1070 == 2) {
        if ((int)local_1a14 < 0) {
          iVar20 = (int)local_1a14 + 1;
          if (iVar20 < 1) {
            iVar20 = -iVar20;
          }
          local_1fa4 = -iVar20 / 2 + -1;
        }
        else {
          local_1fa4 = (int)local_1a14 / 2;
        }
        local_1068 = local_1fa4;
      }
      else if (local_1070 == 4) {
        if ((int)local_1a14 < 0) {
          iVar20 = (int)local_1a14 + 1;
          if (iVar20 < 1) {
            iVar20 = -iVar20;
          }
          local_1fa8 = -iVar20 / 4 + -1;
        }
        else {
          local_1fa8 = (int)local_1a14 / 4;
        }
        local_1068 = local_1fa8;
      }
      else {
        if ((int)local_1a14 < 0) {
          iVar20 = (int)local_1a14 + 1;
          if (iVar20 < 1) {
            iVar20 = -iVar20;
          }
          local_1fac = -iVar20 / local_1070 + -1;
        }
        else {
          local_1fac = (int)local_1a14 / local_1070;
        }
        local_1068 = local_1fac;
      }
    }
    local_1a14._4_4_ = (int)((ulong)lVar21 >> 0x20);
    local_1078 = local_1a14._4_4_;
    local_1a14._0_4_ = local_1068;
    local_107c = in_stack_00000010[1];
    local_1074 = local_1078;
    if (local_107c != 1) {
      if (local_107c == 2) {
        if (lVar21 < 0) {
          iVar20 = local_1078 + 1;
          if (iVar20 < 1) {
            iVar20 = -iVar20;
          }
          local_1fb4 = -iVar20 / 2 + -1;
        }
        else {
          local_1fb4 = local_1078 / 2;
        }
        local_1074 = local_1fb4;
      }
      else if (local_107c == 4) {
        if (lVar21 < 0) {
          iVar20 = local_1078 + 1;
          if (iVar20 < 1) {
            iVar20 = -iVar20;
          }
          local_1fb8 = -iVar20 / 4 + -1;
        }
        else {
          local_1fb8 = local_1078 / 4;
        }
        local_1074 = local_1fb8;
      }
      else {
        if (lVar21 < 0) {
          iVar20 = local_1078 + 1;
          if (iVar20 < 1) {
            iVar20 = -iVar20;
          }
          local_1fbc = -iVar20 / local_107c + -1;
        }
        else {
          local_1fbc = local_1078 / local_107c;
        }
        local_1074 = local_1fbc;
      }
    }
    local_1a14._4_4_ = local_1074;
    local_1a0c._0_4_ = (int)unique0x00012000;
    local_1084 = (int)local_1a0c;
    local_1088 = in_stack_00000010[2];
    local_1080 = local_1084;
    if (local_1088 != 1) {
      if (local_1088 == 2) {
        if ((int)local_1a0c < 0) {
          iVar20 = (int)local_1a0c + 1;
          if (iVar20 < 1) {
            iVar20 = -iVar20;
          }
          local_1fc4 = -iVar20 / 2 + -1;
        }
        else {
          local_1fc4 = (int)local_1a0c / 2;
        }
        local_1080 = local_1fc4;
      }
      else if (local_1088 == 4) {
        if ((int)local_1a0c < 0) {
          iVar20 = (int)local_1a0c + 1;
          if (iVar20 < 1) {
            iVar20 = -iVar20;
          }
          local_1fc8 = -iVar20 / 4 + -1;
        }
        else {
          local_1fc8 = (int)local_1a0c / 4;
        }
        local_1080 = local_1fc8;
      }
      else {
        if ((int)local_1a0c < 0) {
          iVar20 = (int)local_1a0c + 1;
          if (iVar20 < 1) {
            iVar20 = -iVar20;
          }
          local_1fcc = -iVar20 / local_1088 + -1;
        }
        else {
          local_1fcc = (int)local_1a0c / local_1088;
        }
        local_1080 = local_1fcc;
      }
    }
    local_1a0c._4_4_ = (int)((ulong)unique0x00012000 >> 0x20);
    local_201c = local_1a0c._4_4_;
    local_1a0c._0_4_ = local_1080;
    local_1100 = &local_19fc;
    local_1108 = local_1158;
    if (local_19fc == 0) {
      local_1118 = (long)&local_1a0c + 4;
      local_1048 = local_201c;
      local_104c = *in_stack_00000010;
      local_1044 = local_1048;
      if (local_104c != 1) {
        if (local_104c == 2) {
          if (unique0x00012000 < 0) {
            local_201c = local_201c + 1;
            if (local_201c < 1) {
              local_201c = -local_201c;
            }
            local_2014 = -local_201c / 2 + -1;
          }
          else {
            local_2014 = local_201c / 2;
          }
          local_1044 = local_2014;
        }
        else if (local_104c == 4) {
          if (unique0x00012000 < 0) {
            local_201c = local_201c + 1;
            if (local_201c < 1) {
              local_201c = -local_201c;
            }
            local_2018 = -local_201c / 4 + -1;
          }
          else {
            local_2018 = local_201c / 4;
          }
          local_1044 = local_2018;
        }
        else {
          if (unique0x00012000 < 0) {
            local_201c = local_201c + 1;
            if (local_201c < 1) {
              local_201c = -local_201c;
            }
            local_201c = -local_201c / local_104c + -1;
          }
          else {
            local_201c = local_201c / local_104c;
          }
          local_1044 = local_201c;
        }
      }
      local_1a0c._4_4_ = local_1044;
      local_1a04._0_4_ = (int)lVar3;
      local_1054 = (int)local_1a04;
      local_1058 = in_stack_00000010[1];
      local_1050 = local_1054;
      if (local_1058 != 1) {
        if (local_1058 == 2) {
          if ((int)local_1a04 < 0) {
            iVar20 = (int)local_1a04 + 1;
            if (iVar20 < 1) {
              iVar20 = -iVar20;
            }
            in_stack_ffffffffffffdfdc = -iVar20 / 2 + -1;
            local_1050 = in_stack_ffffffffffffdfdc;
          }
          else {
            in_stack_ffffffffffffdfdc = (int)local_1a04 / 2;
            local_1050 = in_stack_ffffffffffffdfdc;
          }
        }
        else if (local_1058 == 4) {
          if ((int)local_1a04 < 0) {
            iVar20 = (int)local_1a04 + 1;
            if (iVar20 < 1) {
              iVar20 = -iVar20;
            }
            in_stack_ffffffffffffdfd8 = -iVar20 / 4 + -1;
            local_1050 = in_stack_ffffffffffffdfd8;
          }
          else {
            in_stack_ffffffffffffdfd8 = (int)local_1a04 / 4;
            local_1050 = in_stack_ffffffffffffdfd8;
          }
        }
        else if ((int)local_1a04 < 0) {
          iVar20 = (int)local_1a04 + 1;
          if (iVar20 < 1) {
            iVar20 = -iVar20;
          }
          in_stack_ffffffffffffdfd4 = -iVar20 / local_1058 + -1;
          local_1050 = in_stack_ffffffffffffdfd4;
        }
        else {
          in_stack_ffffffffffffdfd4 = (int)local_1a04 / local_1058;
          local_1050 = in_stack_ffffffffffffdfd4;
        }
      }
      local_1a04._4_4_ = (int)((ulong)lVar3 >> 0x20);
      local_1060 = local_1a04._4_4_;
      local_1a04._0_4_ = local_1050;
      local_1064 = in_stack_00000010[2];
      local_105c = local_1060;
      if (local_1064 != 1) {
        if (local_1064 == 2) {
          if (lVar3 < 0) {
            iVar20 = local_1060 + 1;
            if (iVar20 < 1) {
              iVar20 = -iVar20;
            }
            in_stack_ffffffffffffdfcc = -iVar20 / 2 + -1;
            local_105c = in_stack_ffffffffffffdfcc;
          }
          else {
            in_stack_ffffffffffffdfcc = local_1060 / 2;
            local_105c = in_stack_ffffffffffffdfcc;
          }
        }
        else if (local_1064 == 4) {
          if (lVar3 < 0) {
            iVar20 = local_1060 + 1;
            if (iVar20 < 1) {
              iVar20 = -iVar20;
            }
            in_stack_ffffffffffffdfc8 = -iVar20 / 4 + -1;
            local_105c = in_stack_ffffffffffffdfc8;
          }
          else {
            in_stack_ffffffffffffdfc8 = local_1060 / 4;
            local_105c = in_stack_ffffffffffffdfc8;
          }
        }
        else {
          if (lVar3 < 0) {
            iVar20 = local_1060 + 1;
            if (iVar20 < 1) {
              iVar20 = -iVar20;
            }
            local_203c = -iVar20 / local_1064 + -1;
          }
          else {
            local_203c = local_1060 / local_1064;
          }
          local_105c = local_203c;
        }
      }
      local_1a04._4_4_ = local_105c;
      local_1a0c = local_1a0c;
      local_1a04 = local_1a04;
    }
    else {
      IntVect::IntVect(&local_116c,0);
      lVar21 = local_1a04;
      for (local_1170 = 0; local_1170 < 3; local_1170 = local_1170 + 1) {
        local_10f0 = &local_19fc;
        local_10f4 = local_1170;
        local_101c = local_1170;
        local_1010 = local_1170;
        if ((local_19fc & 1 << ((byte)local_1170 & 0x1f)) != 0) {
          local_10e0 = (long)&local_1a0c + 4;
          local_10e4 = local_1170;
          local_1148 = local_1160;
          local_114c = local_1170;
          if (*(int *)(local_10e0 + (long)local_1170 * 4) % local_1160[local_1170] != 0) {
            local_10d0 = &local_116c;
            local_10d4 = local_1170;
            local_10d8 = 1;
            local_10d0->vect[local_1170] = 1;
          }
        }
        local_1018 = local_10f0;
      }
      local_1128 = (long)&local_1a0c + 4;
      local_1130 = local_1160;
      local_1024 = local_1a0c._4_4_;
      local_1028 = *local_1160;
      local_1020 = local_1024;
      if (local_1028 != 1) {
        if (local_1028 == 2) {
          if (local_1a0c < 0) {
            iVar20 = local_1a0c._4_4_ + 1;
            if (iVar20 < 1) {
              iVar20 = -iVar20;
            }
            local_1fdc = -iVar20 / 2 + -1;
          }
          else {
            local_1fdc = local_1a0c._4_4_ / 2;
          }
          local_1020 = local_1fdc;
        }
        else if (local_1028 == 4) {
          if (local_1a0c < 0) {
            iVar20 = local_1a0c._4_4_ + 1;
            if (iVar20 < 1) {
              iVar20 = -iVar20;
            }
            local_1fe0 = -iVar20 / 4 + -1;
          }
          else {
            local_1fe0 = local_1a0c._4_4_ / 4;
          }
          local_1020 = local_1fe0;
        }
        else {
          if (local_1a0c < 0) {
            iVar20 = local_1a0c._4_4_ + 1;
            if (iVar20 < 1) {
              iVar20 = -iVar20;
            }
            local_1fe4 = -iVar20 / local_1028 + -1;
          }
          else {
            local_1fe4 = local_1a0c._4_4_ / local_1028;
          }
          local_1020 = local_1fe4;
        }
      }
      local_1a0c._4_4_ = local_1020;
      local_1030 = (int)local_1a04;
      local_1034 = local_1160[1];
      local_102c = local_1030;
      if (local_1034 != 1) {
        if (local_1034 == 2) {
          if ((int)local_1a04 < 0) {
            iVar20 = (int)local_1a04 + 1;
            if (iVar20 < 1) {
              iVar20 = -iVar20;
            }
            local_1fec = -iVar20 / 2 + -1;
          }
          else {
            local_1fec = (int)local_1a04 / 2;
          }
          local_102c = local_1fec;
        }
        else if (local_1034 == 4) {
          if ((int)local_1a04 < 0) {
            iVar20 = (int)local_1a04 + 1;
            if (iVar20 < 1) {
              iVar20 = -iVar20;
            }
            local_1ff0 = -iVar20 / 4 + -1;
          }
          else {
            local_1ff0 = (int)local_1a04 / 4;
          }
          local_102c = local_1ff0;
        }
        else {
          if ((int)local_1a04 < 0) {
            iVar20 = (int)local_1a04 + 1;
            if (iVar20 < 1) {
              iVar20 = -iVar20;
            }
            local_1ff4 = -iVar20 / local_1034 + -1;
          }
          else {
            local_1ff4 = (int)local_1a04 / local_1034;
          }
          local_102c = local_1ff4;
        }
      }
      local_103c = local_1a04._4_4_;
      local_1a04._0_4_ = local_102c;
      local_1040 = local_1160[2];
      local_1038 = local_103c;
      if (local_1040 != 1) {
        if (local_1040 == 2) {
          if (lVar21 < 0) {
            iVar20 = local_103c + 1;
            if (iVar20 < 1) {
              iVar20 = -iVar20;
            }
            local_1ffc = -iVar20 / 2 + -1;
          }
          else {
            local_1ffc = local_103c / 2;
          }
          local_1038 = local_1ffc;
        }
        else if (local_1040 == 4) {
          if (lVar21 < 0) {
            iVar20 = local_103c + 1;
            if (iVar20 < 1) {
              iVar20 = -iVar20;
            }
            local_2000 = -iVar20 / 4 + -1;
          }
          else {
            local_2000 = local_103c / 4;
          }
          local_1038 = local_2000;
        }
        else {
          if (lVar21 < 0) {
            iVar20 = local_103c + 1;
            if (iVar20 < 1) {
              iVar20 = -iVar20;
            }
            local_2004 = -iVar20 / local_1040 + -1;
          }
          else {
            local_2004 = local_103c / local_1040;
          }
          local_1038 = local_2004;
        }
      }
      local_1a04._4_4_ = local_1038;
      local_10c0 = (long)&local_1a0c + 4;
      local_10c8 = &local_116c;
      local_1094 = 0;
      local_1a0c._4_4_ = local_116c.vect[0] + local_1a0c._4_4_;
      local_10a4 = 1;
      iVar20 = local_1a04._4_4_;
      local_1a04._0_4_ = local_116c.vect[1] + (int)local_1a04;
      local_10b4 = 2;
      local_1a04._4_4_ = local_116c.vect[2] + iVar20;
      local_1a0c = local_1a0c;
      local_1a04 = local_1a04;
      local_10b0 = local_10c8;
      local_10a0 = local_10c8;
      local_1090 = local_10c8;
    }
  }
  CoordSys::CellSizeArray(&local_1a30,in_stack_00000028);
  GpuArray<amrex::Array4<const_double>,_3U>::GpuArray
            ((GpuArray<amrex::Array4<const_double>,_3U> *)in_stack_ffffffffffffdf90);
  GpuArray<amrex::Array4<double>,_3U>::GpuArray(in_stack_ffffffffffffdf90);
  GpuArray<amrex::Array4<const_int>,_3U>::GpuArray
            ((GpuArray<amrex::Array4<const_int>,_3U> *)in_stack_ffffffffffffdf90);
  for (local_1c74 = 0; local_1c74 < 3; local_1c74 = local_1c74 + 1) {
    ppFVar17 = std::array<amrex::FArrayBox_*,_3UL>::operator[]
                         ((array<amrex::FArrayBox_*,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80),
                          CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78));
    local_1908 = *ppFVar17;
    local_190c = local_19d4;
    local_2d0 = (local_1908->super_BaseFab<double>).dptr;
    local_2d8 = &(local_1908->super_BaseFab<double>).domain;
    local_2dc = (local_1908->super_BaseFab<double>).nvar;
    local_284 = 0;
    local_2b0 = (local_2d8->smallend).vect[0];
    local_294 = 1;
    iStack_2ac = (local_1908->super_BaseFab<double>).domain.smallend.vect[1];
    local_2f8.x = (local_2d8->smallend).vect[0];
    local_2f8.y = (local_2d8->smallend).vect[1];
    local_2a4 = 2;
    local_2f8.z = (local_1908->super_BaseFab<double>).domain.smallend.vect[2];
    local_230 = &(local_1908->super_BaseFab<double>).domain.bigend;
    local_234 = 0;
    local_260 = local_230->vect[0] + 1;
    local_240 = &(local_1908->super_BaseFab<double>).domain.bigend;
    local_244 = 1;
    iStack_25c = (local_1908->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_250 = &(local_1908->super_BaseFab<double>).domain.bigend;
    local_254 = 2;
    local_318.z = (local_1908->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_318.y = iStack_25c;
    local_318.x = local_260;
    local_308._0_8_ = local_318._0_8_;
    local_308.z = local_318.z;
    local_2e8._0_8_ = local_2f8._0_8_;
    local_2e8.z = local_2f8.z;
    local_2c8._0_8_ = local_2f8._0_8_;
    local_2c8.z = local_2f8.z;
    local_2b8 = local_2d8;
    local_2a8 = local_2f8.z;
    local_2a0 = local_2d8;
    local_290 = local_2d8;
    local_280 = local_2d8;
    local_278._0_8_ = local_318._0_8_;
    local_278.z = local_318.z;
    local_268 = local_2d8;
    local_258 = local_318.z;
    Array4<const_double>::Array4(&local_1950,local_2d0,&local_2e8,&local_308,local_2dc);
    Array4<const_double>::Array4<const_double,_0>(&local_1cb8,&local_1950,local_190c);
    local_18bc = local_1c74;
    lVar21 = (long)local_1c74;
    *(ulong *)(auStack_1ac8 + lVar21 * 0x40 + 4) = CONCAT44(local_1cb8.end.y,local_1cb8.end.x);
    *(undefined8 *)((long)local_1ab0 + (lVar21 * 8 + 1) * 8 + -0x14) = local_1cb8._52_8_;
    aLStack_1ae8[lVar21 * 8 + 3] = local_1cb8.begin._0_8_;
    *(ulong *)(auStack_1ac8 + lVar21 * 0x40) = CONCAT44(local_1cb8.end.x,local_1cb8.begin.z);
    aLStack_1ae8[lVar21 * 8 + 1] = local_1cb8.kstride;
    aLStack_1ae8[lVar21 * 8 + 2] = local_1cb8.nstride;
    (&local_1af0)[lVar21 * 8] = (long)local_1cb8.p;
    aLStack_1ae8[lVar21 * 8] = local_1cb8.jstride;
    local_18b8 = &local_1af0;
    ppFVar17 = std::array<amrex::FArrayBox_*,_3UL>::operator[]
                         ((array<amrex::FArrayBox_*,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80),
                          CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78));
    local_1958 = *ppFVar17;
    local_195c = local_19e4;
    local_1e0 = (local_1958->super_BaseFab<double>).dptr;
    local_1e8 = &(local_1958->super_BaseFab<double>).domain;
    local_1ec = (local_1958->super_BaseFab<double>).nvar;
    local_194 = 0;
    local_1c0 = (local_1e8->smallend).vect[0];
    local_1a4 = 1;
    iStack_1bc = (local_1958->super_BaseFab<double>).domain.smallend.vect[1];
    local_208.x = (local_1e8->smallend).vect[0];
    local_208.y = (local_1e8->smallend).vect[1];
    local_1b4 = 2;
    local_208.z = (local_1958->super_BaseFab<double>).domain.smallend.vect[2];
    local_140 = &(local_1958->super_BaseFab<double>).domain.bigend;
    local_144 = 0;
    local_170 = local_140->vect[0] + 1;
    local_150 = &(local_1958->super_BaseFab<double>).domain.bigend;
    local_154 = 1;
    iStack_16c = (local_1958->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_160 = &(local_1958->super_BaseFab<double>).domain.bigend;
    local_164 = 2;
    local_228.z = (local_1958->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_228.y = iStack_16c;
    local_228.x = local_170;
    local_214._0_8_ = local_228._0_8_;
    local_214.z = local_228.z;
    local_1f8._0_8_ = local_208._0_8_;
    local_1f8.z = local_208.z;
    local_1d8._0_8_ = local_208._0_8_;
    local_1d8.z = local_208.z;
    local_1c8 = local_1e8;
    local_1b8 = local_208.z;
    local_1b0 = local_1e8;
    local_1a0 = local_1e8;
    local_190 = local_1e8;
    local_188._0_8_ = local_228._0_8_;
    local_188.z = local_228.z;
    local_178 = local_1e8;
    local_168 = local_228.z;
    Array4<double>::Array4(&local_19a0,local_1e0,&local_1f8,&local_214,local_1ec);
    Array4<double>::Array4<double,_0>(&local_1cf8,&local_19a0,local_195c);
    local_1878 = local_1bb0;
    local_187c = local_1c74;
    memcpy(local_1878 + (long)local_1c74 * 8,&local_1cf8,0x3c);
    ppIVar18 = std::array<amrex::IArrayBox_*,_3UL>::operator[]
                         ((array<amrex::IArrayBox_*,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80),
                          CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78));
    if (*ppIVar18 != (value_type)0x0) {
      ppIVar18 = std::array<amrex::IArrayBox_*,_3UL>::operator[]
                           ((array<amrex::IArrayBox_*,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80),
                            CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78));
      local_1828 = *ppIVar18;
      local_182c = 0;
      local_f0 = (local_1828->super_BaseFab<int>).dptr;
      local_f8 = &(local_1828->super_BaseFab<int>).domain;
      local_fc = (local_1828->super_BaseFab<int>).nvar;
      local_a4 = 0;
      local_d0 = (local_f8->smallend).vect[0];
      local_b4 = 1;
      iStack_cc = (local_1828->super_BaseFab<int>).domain.smallend.vect[1];
      local_118.x = (local_f8->smallend).vect[0];
      local_118.y = (local_f8->smallend).vect[1];
      local_c4 = 2;
      local_118.z = (local_1828->super_BaseFab<int>).domain.smallend.vect[2];
      local_50 = &(local_1828->super_BaseFab<int>).domain.bigend;
      local_54 = 0;
      local_80 = local_50->vect[0] + 1;
      local_60 = &(local_1828->super_BaseFab<int>).domain.bigend;
      local_64 = 1;
      iStack_7c = (local_1828->super_BaseFab<int>).domain.bigend.vect[1] + 1;
      local_70 = &(local_1828->super_BaseFab<int>).domain.bigend;
      local_74 = 2;
      local_138.z = (local_1828->super_BaseFab<int>).domain.bigend.vect[2] + 1;
      local_138.y = iStack_7c;
      local_138.x = local_80;
      local_124._0_8_ = local_138._0_8_;
      local_124.z = local_138.z;
      local_108._0_8_ = local_118._0_8_;
      local_108.z = local_118.z;
      local_e8._0_8_ = local_118._0_8_;
      local_e8.z = local_118.z;
      local_d8 = local_f8;
      local_c8 = local_118.z;
      local_c0 = local_f8;
      local_b0 = local_f8;
      local_a0 = local_f8;
      local_98._0_8_ = local_138._0_8_;
      local_98.z = local_138.z;
      local_88 = local_f8;
      local_78 = local_138.z;
      Array4<const_int>::Array4(&local_1870,local_f0,&local_108,&local_124,local_fc);
      Array4<const_int>::Array4<const_int,_0>(&local_1d38,&local_1870,local_182c);
      local_17e8 = local_1c70;
      local_17ec = local_1c74;
      memcpy(local_17e8 + (long)local_1c74 * 0x40,&local_1d38,0x3c);
    }
  }
  local_19a8 = &stack0x00000048;
  local_17a8 = std::array<amrex::IndexType,_3UL>::operator[]
                         ((array<amrex::IndexType,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80),
                          CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78));
  local_17a0 = &local_1a14;
  local_1d54 = (undefined1  [8])local_1a14;
  local_1d4c._4_4_ = (int)((ulong)local_1a0c >> 0x20);
  local_1d44._4_4_ = (undefined4)((ulong)local_1a04 >> 0x20);
  local_1d3c = local_19fc;
  local_17ac = local_17a8->itype;
  local_ff8 = local_1d54;
  for (local_ffc = 0; local_ffc < 3; local_ffc = local_ffc + 1) {
    local_fd8 = &local_ff0;
    local_fdc = local_ffc;
    local_fcc = local_ffc;
    local_fac = local_ffc;
    bVar19 = (byte)local_ffc;
    local_1000 = (uint)((local_17ac & 1 << (bVar19 & 0x1f)) != 0);
    local_fe8 = &local_1d3c;
    local_fec = local_ffc;
    local_fbc = local_ffc;
    local_fb0 = local_ffc;
    local_1004 = (uint)((local_1d3c & 1 << (bVar19 & 0x1f)) != 0);
    local_1008 = local_1000 - local_1004;
    local_fa0 = (long)&local_1d4c + 4;
    local_fa4 = local_ffc;
    *(int *)(local_fa0 + (long)local_ffc * 4) =
         local_1008 + *(int *)(local_fa0 + (long)local_ffc * 4);
    local_e60 = &local_1d3c;
    local_e64 = local_ffc;
    if (local_1000 == 0) {
      local_e44 = local_ffc;
      local_e38 = local_ffc;
      local_1d3c = (1 << (bVar19 & 0x1f) ^ 0xffffffffU) & local_1d3c;
      local_e40 = local_e60;
    }
    else {
      local_e54 = local_ffc;
      local_e48 = local_ffc;
      local_1d3c = 1 << (bVar19 & 0x1f) | local_1d3c;
      local_e50 = local_e60;
    }
    local_fc8 = local_fd8;
    local_fb8 = local_fe8;
    local_fa8 = local_1008;
    local_e68 = local_1000;
  }
  iVar20 = local_1d4c._4_4_;
  local_1d4c = local_1a0c;
  uVar13 = local_1d44._4_4_;
  local_1d44 = (undefined1  [8])local_1a04;
  local_ff0 = local_17ac;
  lVar21 = local_1d4c;
  local_1d4c._4_4_ = iVar20;
  unique0x10007f48 = (long)local_1d44;
  local_1d44._4_4_ = uVar13;
  local_17c0 = std::array<amrex::IndexType,_3UL>::operator[]
                         ((array<amrex::IndexType,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80),
                          CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78));
  uVar13 = local_1d44._4_4_;
  iVar20 = local_1d4c._4_4_;
  local_17b8 = &local_1a14;
  local_1d70 = (undefined1  [8])local_1a14;
  local_1d68._4_4_ = (int)((ulong)local_1a0c >> 0x20);
  local_1d60._4_4_ = (undefined4)((ulong)local_1a04 >> 0x20);
  local_1d58 = local_19fc;
  local_17c4 = local_17c0->itype;
  local_f88 = local_1d70;
  for (local_f8c = 0; local_f8c < 3; local_f8c = local_f8c + 1) {
    local_f68 = &local_f80;
    local_f6c = local_f8c;
    local_f5c = local_f8c;
    local_f3c = local_f8c;
    bVar19 = (byte)local_f8c;
    local_f90 = (uint)((local_17c4 & 1 << (bVar19 & 0x1f)) != 0);
    local_f78 = &local_1d58;
    local_f7c = local_f8c;
    local_f4c = local_f8c;
    local_f40 = local_f8c;
    local_f94 = (uint)((local_1d58 & 1 << (bVar19 & 0x1f)) != 0);
    local_f98 = local_f90 - local_f94;
    local_f30 = (long)&local_1d68 + 4;
    local_f34 = local_f8c;
    *(int *)(local_f30 + (long)local_f8c * 4) =
         local_f98 + *(int *)(local_f30 + (long)local_f8c * 4);
    local_e88 = &local_1d58;
    local_e8c = local_f8c;
    if (local_f90 == 0) {
      local_e34 = local_f8c;
      local_e28 = local_f8c;
      local_1d58 = (1 << (bVar19 & 0x1f) ^ 0xffffffffU) & local_1d58;
      local_e30 = local_e88;
    }
    else {
      local_e7c = local_f8c;
      local_e6c = local_f8c;
      local_1d58 = 1 << (bVar19 & 0x1f) | local_1d58;
      local_e78 = local_e88;
    }
    local_f58 = local_f68;
    local_f48 = local_f78;
    local_f38 = local_f98;
    local_e90 = local_f90;
  }
  iVar2 = local_1d68._4_4_;
  local_1d68 = local_1a0c;
  uVar15 = local_1d60._4_4_;
  local_1d60 = (undefined1  [8])local_1a04;
  local_f80 = local_17c4;
  lVar21 = local_1d68;
  local_1d68._4_4_ = iVar2;
  unique0x10007dbc = (long)local_1d60;
  local_1d60._4_4_ = uVar15;
  lVar3 = local_1d4c;
  local_1d4c._4_4_ = iVar20;
  auVar22 = local_1d44;
  local_1d44._4_4_ = uVar13;
  local_17d8 = std::array<amrex::IndexType,_3UL>::operator[]
                         ((array<amrex::IndexType,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80),
                          CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78));
  uVar15 = local_1d44._4_4_;
  auVar22 = local_1d44;
  iVar2 = local_1d4c._4_4_;
  uVar13 = local_1d60._4_4_;
  iVar20 = local_1d68._4_4_;
  local_17d0 = &local_1a14;
  local_1d8c = (undefined1  [8])local_1a14;
  local_1d84._4_4_ = (int)((ulong)local_1a0c >> 0x20);
  local_1d7c._4_4_ = (undefined4)((ulong)local_1a04 >> 0x20);
  local_1d74 = local_19fc;
  local_17dc = local_17d8->itype;
  local_f18 = local_1d8c;
  for (local_f1c = 0; local_f1c < 3; local_f1c = local_f1c + 1) {
    local_ef8 = &local_f10;
    local_efc = local_f1c;
    local_eec = local_f1c;
    local_ecc = local_f1c;
    bVar19 = (byte)local_f1c;
    local_f20 = (uint)((local_17dc & 1 << (bVar19 & 0x1f)) != 0);
    local_f08 = &local_1d74;
    local_f0c = local_f1c;
    local_edc = local_f1c;
    local_ed0 = local_f1c;
    local_f24 = (uint)((local_1d74 & 1 << (bVar19 & 0x1f)) != 0);
    local_f28 = local_f20 - local_f24;
    local_ec0 = (long)&local_1d84 + 4;
    local_ec4 = local_f1c;
    *(int *)(local_ec0 + (long)local_f1c * 4) =
         local_f28 + *(int *)(local_ec0 + (long)local_f1c * 4);
    local_eb0 = &local_1d74;
    local_eb4 = local_f1c;
    if (local_f20 == 0) {
      local_e24 = local_f1c;
      local_e14 = local_f1c;
      local_1d74 = (1 << (bVar19 & 0x1f) ^ 0xffffffffU) & local_1d74;
      local_e20 = local_eb0;
    }
    else {
      local_ea4 = local_f1c;
      local_e94 = local_f1c;
      local_1d74 = 1 << (bVar19 & 0x1f) | local_1d74;
      local_ea0 = local_eb0;
    }
    local_ee8 = local_ef8;
    local_ed8 = local_f08;
    local_ec8 = local_f28;
    local_eb8 = local_f20;
  }
  local_1738 = local_1d54;
  local_15fc = 0;
  iVar1 = local_1d54._0_4_;
  local_160c = 1;
  lVar21 = (long)local_1d54._4_4_;
  local_161c = 2;
  local_1dd0._4_4_ = (undefined4)local_1d4c;
  local_1688 = (long)&local_1d4c + 4;
  local_168c = 0;
  local_16b8 = iVar2;
  local_1698 = (long)&local_1d4c + 4;
  local_169c = 1;
  auStack_16b4._0_4_ = (undefined4)auVar22;
  local_16d0 = CONCAT84(auVar22,iVar2);
  local_16a8 = (long)&local_1d4c + 4;
  local_16ac = 2;
  local_16c8._0_4_ = (long)uVar15;
  unique0x10007508 = local_1a0c;
  auVar5 = (undefined1  [8])local_1a04;
  local_1d44 = auVar22;
  auStack_1744._4_4_ = local_1dd0._4_4_;
  local_172c = iVar1;
  auStack_1728._0_4_ = (undefined4)lVar21;
  auStack_1728._4_4_ = local_1dd0._4_4_;
  local_16c0 = local_1738;
  auStack_16b4._4_4_ = (undefined4)(long)local_16c8;
  local_1618 = local_1738;
  local_1608 = local_1738;
  local_15f8 = local_1738;
  local_f10 = local_17dc;
  local_1748 = iVar1;
  auStack_1744._0_4_ = (undefined4)lVar21;
  iVar10 = iVar2;
  uVar12 = uVar15;
  do {
    local_1d44._4_4_ = uVar12;
    local_1d4c._4_4_ = iVar10;
    local_1d60._4_4_ = uVar13;
    local_1d68._4_4_ = iVar20;
    local_1d7c = auVar5;
    local_1d84 = unique0x10007518;
    uVar14 = local_1d44._4_4_;
    iVar11 = local_1d4c._4_4_;
    uVar12 = local_1d60._4_4_;
    auVar5 = local_1d60;
    iVar10 = local_1d68._4_4_;
    uVar13 = local_1d7c._4_4_;
    iVar20 = local_1d84._4_4_;
    local_1dd0._0_4_ = (undefined4)lVar21;
    if ((int)uVar15 < (int)local_1dd0._4_4_) {
      local_1760 = local_1d70;
      local_15cc = 0;
      iVar2 = local_1d70._0_4_;
      local_15dc = 1;
      lVar21 = (long)local_1d70._4_4_;
      local_15ec = 2;
      local_1e20._4_4_ = (undefined4)local_1d68;
      local_1658 = (long)&local_1d68 + 4;
      local_165c = 0;
      local_16dc = iVar10;
      local_1668 = (long)&local_1d68 + 4;
      local_166c = 1;
      auStack_16d8._0_4_ = (undefined4)local_1d60;
      local_16f8 = CONCAT84(local_1d60,iVar10);
      local_1678 = (long)&local_1d68 + 4;
      local_167c = 2;
      local_16f0._0_4_ = (long)uVar12;
      auStack_176c._4_4_ = local_1e20._4_4_;
      local_1754 = iVar2;
      auStack_1750._0_4_ = (undefined4)lVar21;
      auStack_1750._4_4_ = local_1e20._4_4_;
      local_16e8 = local_1760;
      auStack_16d8._4_4_ = (undefined4)(long)local_16f0;
      local_15e8 = local_1760;
      local_15d8 = local_1760;
      local_15c8 = local_1760;
      local_1770 = iVar2;
      auStack_176c._0_4_ = (undefined4)lVar21;
      iVar1 = iVar10;
      uVar15 = uVar12;
      do {
        local_1d44._4_4_ = uVar14;
        local_1d4c._4_4_ = iVar11;
        local_1d60._4_4_ = uVar15;
        local_1d68._4_4_ = iVar1;
        local_1d7c._4_4_ = uVar13;
        local_1d84._4_4_ = iVar20;
        uVar15 = local_1d44._4_4_;
        iVar11 = local_1d4c._4_4_;
        uVar13 = local_1d60._4_4_;
        iVar1 = local_1d68._4_4_;
        auVar22._4_4_ = (long)local_1d7c._4_4_;
        iVar20 = local_1d84._4_4_;
        local_1e20._0_4_ = (undefined4)lVar21;
        if ((int)uVar12 < (int)local_1e20._4_4_) {
          local_1788 = local_1d8c;
          local_159c = 0;
          iVar2 = local_1d8c._0_4_;
          local_15ac = 1;
          lVar21 = (long)local_1d8c._4_4_;
          local_15bc = 2;
          local_1e70._4_4_ = local_1d84;
          local_1628 = (long)&local_1d84 + 4;
          local_162c = 0;
          local_1704 = iVar20;
          local_1638 = (long)&local_1d84 + 4;
          local_163c = 1;
          auStack_1700._0_4_ = (undefined4)local_1d7c;
          local_1720 = CONCAT84(local_1d7c,iVar20);
          local_1648 = (long)&local_1d84 + 4;
          local_164c = 2;
          local_1718._0_4_ = auVar22._4_4_;
          auVar22 = local_1d7c;
          auStack_1794._4_4_ = (undefined4)local_1e70._4_4_;
          local_177c = iVar2;
          auStack_1778._0_4_ = (undefined4)lVar21;
          auStack_1778._4_4_ = (undefined4)local_1e70._4_4_;
          local_1710 = local_1788;
          auStack_1700._4_4_ = (undefined4)(long)local_1718;
          local_15b8 = local_1788;
          local_15a8 = local_1788;
          local_1598 = local_1788;
          local_1798 = iVar2;
          auStack_1794._0_4_ = (undefined4)lVar21;
          iVar10 = iVar20;
          uVar12 = (undefined4)auVar22._4_4_;
          do {
            local_1d44._4_4_ = uVar15;
            local_1d4c._4_4_ = iVar11;
            local_1d60._4_4_ = uVar13;
            local_1d68._4_4_ = iVar1;
            local_1d7c._4_4_ = uVar12;
            local_1d84._4_4_ = iVar10;
            uVar12 = local_1d44._4_4_;
            iVar11 = local_1d4c._4_4_;
            uVar15 = local_1d60._4_4_;
            iVar10 = local_1d68._4_4_;
            uVar13 = local_1d7c._4_4_;
            iVar1 = local_1d84._4_4_;
            lVar3 = lVar21;
            if ((int)auVar22._4_4_ < (int)local_1e70._4_4_) {
              local_19b0 = &stack0x00000048;
              lVar21 = local_1d84;
              local_1d84._4_4_ = iVar1;
              auVar22 = local_1d7c;
              local_1d7c._4_4_ = uVar13;
              unique0x10007d08 = local_1d68;
              local_1d68._4_4_ = iVar10;
              auVar5 = local_1d60;
              local_1d60._4_4_ = uVar15;
              lVar3 = local_1d4c;
              local_1d4c._4_4_ = iVar11;
              auVar7 = local_1d44;
              local_1d44._4_4_ = uVar12;
              memcpy(auStack_1f60,local_1bb0,0xc0);
              auVar7 = local_1d44;
              lVar3 = local_1d4c;
              auVar5 = local_1d60;
              unique0x100071b0 = local_1d68;
              auVar22 = local_1d7c;
              lVar21 = local_1d84;
              local_1ea0 = *(undefined8 *)in_stack_00000010;
              local_1e98 = in_stack_00000010[2];
              local_1e90 = local_1a30.arr[0];
              local_1e88 = local_1a30.arr[1];
              local_1e80 = local_1a30.arr[2];
              iVar20 = local_1d84._4_4_;
              local_1d84 = lVar21;
              uVar13 = local_1d7c._4_4_;
              local_1d7c = auVar22;
              iVar2 = local_1d68._4_4_;
              local_1d68 = unique0x100071b0;
              uVar15 = local_1d60._4_4_;
              local_1d60 = auVar5;
              iVar1 = local_1d4c._4_4_;
              local_1d4c = lVar3;
              uVar12 = local_1d44._4_4_;
              local_1d44 = auVar7;
              lVar21 = local_1d84;
              local_1d84._4_4_ = iVar20;
              auVar22 = local_1d7c;
              local_1d7c._4_4_ = uVar13;
              unique0x10007d14 = local_1d68;
              local_1d68._4_4_ = iVar2;
              auVar5 = local_1d60;
              local_1d60._4_4_ = uVar15;
              lVar3 = local_1d4c;
              local_1d4c._4_4_ = iVar1;
              auVar7 = local_1d44;
              local_1d44._4_4_ = uVar12;
              LoopConcurrentOnCpu<amrex::FaceDivFree::interp_arr(std::array<amrex::FArrayBox*,3ul>const&,int,std::array<amrex::FArrayBox*,3ul>const&,int,int,amrex::Box_const&,amrex::IntVect_const&,std::array<amrex::IArrayBox*,3ul>const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<std::array<amrex::BCRec,3ul>,std::allocator<std::array<amrex::BCRec,3ul>>>const&,int,int,amrex::RunOn)::__0>
                        ((Box *)CONCAT44(in_stack_ffffffffffffdfdc,in_stack_ffffffffffffdfd8),
                         in_stack_ffffffffffffdfd4,
                         (anon_class_240_4_370802ce *)
                         CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8));
              return;
            }
            while (local_1d44._4_4_ = uVar12, local_1d4c._4_4_ = iVar11, local_1d60._4_4_ = uVar15,
                  local_1d68._4_4_ = iVar10, local_1d7c._4_4_ = uVar13, local_1d84._4_4_ = iVar1,
                  local_1e70._0_4_ = lVar3, uVar15 = local_1d44._4_4_, iVar11 = local_1d4c._4_4_,
                  uVar13 = local_1d60._4_4_, iVar1 = local_1d68._4_4_, uVar12 = local_1d7c._4_4_,
                  iVar10 = local_1d84._4_4_, iVar4 = iVar2,
                  (int)(long)local_1e70 <= (int)auVar22._0_4_) {
              while (local_1d44._4_4_ = uVar15, local_1d4c._4_4_ = iVar11, local_1d60._4_4_ = uVar13
                    , local_1d68._4_4_ = iVar1, local_1d7c._4_4_ = uVar12, local_1d84._4_4_ = iVar10
                    , local_1e74 = iVar4, uVar12 = local_1d44._4_4_, iVar11 = local_1d4c._4_4_,
                    uVar15 = local_1d60._4_4_, iVar10 = local_1d68._4_4_, uVar13 = local_1d7c._4_4_,
                    iVar1 = local_1d84._4_4_, local_1e74 <= iVar20) {
                lVar3 = local_1d84;
                auVar5 = local_1d7c;
                lVar6 = local_1d68;
                auVar7 = local_1d60;
                lVar8 = local_1d4c;
                auVar9 = local_1d44;
                local_1d84._4_4_ = iVar1;
                local_1d7c._4_4_ = uVar13;
                local_1d68._4_4_ = iVar10;
                local_1d60._4_4_ = uVar15;
                local_1d4c._4_4_ = iVar11;
                local_1d44._4_4_ = uVar12;
                for (local_1e78 = 0; local_1d44 = auVar9, local_1d4c = lVar8, local_1d60 = auVar7,
                    local_1d68 = lVar6, local_1d7c = auVar5, local_1d84 = lVar3,
                    uVar15 = local_1d44._4_4_, iVar11 = local_1d4c._4_4_, uVar13 = local_1d60._4_4_,
                    iVar1 = local_1d68._4_4_, uVar12 = local_1d7c._4_4_, iVar10 = local_1d84._4_4_,
                    local_1e78 < local_19e8; local_1e78 = local_1e78 + 1) {
                  local_144c = local_19d4 + local_1e78;
                  local_1450 = local_19e4 + local_1e78;
                  local_18e8 = &local_1af0;
                  local_18ec = 2;
                  local_1460 = local_1a70;
                  local_18a8 = local_1bb0;
                  local_18ac = 2;
                  local_1468 = local_1b30;
                  local_1818 = local_1c70;
                  local_181c = 2;
                  local_1470 = local_1bf0;
                  local_1440 = local_1e74;
                  local_1448._4_4_ = (undefined4)(long)local_1e70;
                  local_1448._0_4_ = (undefined4)local_1e70._4_4_;
                  local_1454 = 2;
                  local_1478 = in_stack_00000010;
                  lVar3 = local_1d84;
                  local_1d84._4_4_ = iVar10;
                  auVar5 = local_1d7c;
                  local_1d7c._4_4_ = uVar12;
                  lVar6 = local_1d68;
                  local_1d68._4_4_ = iVar1;
                  auVar7 = local_1d60;
                  local_1d60._4_4_ = uVar13;
                  lVar8 = local_1d4c;
                  local_1d4c._4_4_ = iVar11;
                  auVar9 = local_1d44;
                  local_1d44._4_4_ = uVar15;
                  bVar16 = Array4::operator_cast_to_bool(local_1470);
                  auVar9 = local_1d44;
                  lVar8 = local_1d4c;
                  auVar7 = local_1d60;
                  lVar6 = local_1d68;
                  auVar5 = local_1d7c;
                  lVar3 = local_1d84;
                  if (bVar16) {
                    local_8 = local_1470;
                    local_c = local_1440;
                    local_14._4_4_ = local_1448._4_4_;
                    local_14._0_4_ = local_1448._0_4_;
                    local_18 = local_144c;
                    if (*(int *)(*(long *)local_1470 +
                                ((long)(local_1440 - *(int *)(local_1470 + 0x20)) +
                                 (long)(local_1448._4_4_ - *(int *)(local_1470 + 0x24)) *
                                 *(long *)(local_1470 + 8) +
                                 (long)(local_1448._0_4_ - *(int *)(local_1470 + 0x28)) *
                                 *(long *)(local_1470 + 0x10) +
                                (long)local_144c * *(long *)(local_1470 + 0x18)) * 4) != 0)
                    goto LAB_013408e9;
                  }
                  else {
LAB_013408e9:
                    local_1418 = local_1478;
                    local_141c = 0;
                    local_147c = local_1440 * *local_1478;
                    local_1428 = local_1478;
                    local_142c = 1;
                    local_1480 = local_1448._4_4_ * local_1478[1];
                    local_1438 = local_1478;
                    local_143c = 2;
                    local_1484 = local_1448._0_4_ * local_1478[2];
                    if (local_1454 == 0) {
                      local_4d8 = local_1448._4_4_ + -1;
                      local_4dc = local_1448._0_4_ + -1;
                      local_4d0 = local_1460;
                      local_4d4 = local_1440;
                      local_4e0 = local_144c;
                      local_1490 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_1440 - (int)local_1460[4]) +
                                     (long)(local_4d8 - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_4dc - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_4f4._4_4_ = local_1448._4_4_ + -1;
                      local_4e8 = local_1460;
                      local_4ec = local_1440;
                      local_4f4._0_4_ = (long)local_1448._0_4_;
                      local_4f8 = local_144c;
                      local_1498 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_1440 - (int)local_1460[4]) +
                                     (long)(local_4f4._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_1448._0_4_ - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_508 = local_1448._4_4_ + -1;
                      local_50c = local_1448._0_4_ + 1;
                      local_500 = local_1460;
                      local_504 = local_1440;
                      local_510 = local_144c;
                      local_14a0 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_1440 - (int)local_1460[4]) +
                                     (long)(local_508 - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_50c - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_524 = local_1448._0_4_ + -1;
                      local_518 = local_1460;
                      local_520._4_4_ = local_1440;
                      local_520._0_4_ = (long)local_1448._4_4_;
                      local_528 = local_144c;
                      local_14a8 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_1440 - (int)local_1460[4]) +
                                     (long)(local_1448._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_524 - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_530 = local_1460;
                      local_534 = local_1440;
                      local_53c._4_4_ = local_1448._4_4_;
                      local_53c._0_4_ = local_1448._0_4_;
                      local_540 = local_144c;
                      local_14b0 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_1440 - (int)local_1460[4]) +
                                     (long)(local_1448._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_1448._0_4_ - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_554 = local_1448._0_4_ + 1;
                      local_548 = local_1460;
                      local_550._4_4_ = local_1440;
                      local_550._0_4_ = (long)local_1448._4_4_;
                      local_558 = local_144c;
                      local_14b8 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_1440 - (int)local_1460[4]) +
                                     (long)(local_1448._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_554 - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_568 = local_1448._4_4_ + 1;
                      local_56c = local_1448._0_4_ + -1;
                      local_560 = local_1460;
                      local_564 = local_1440;
                      local_570 = local_144c;
                      local_14c0 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_1440 - (int)local_1460[4]) +
                                     (long)(local_568 - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_56c - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_584._4_4_ = local_1448._4_4_ + 1;
                      local_578 = local_1460;
                      local_57c = local_1440;
                      local_584._0_4_ = (long)local_1448._0_4_;
                      local_588 = local_144c;
                      local_14c8 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_1440 - (int)local_1460[4]) +
                                     (long)(local_584._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_1448._0_4_ - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_598 = local_1448._4_4_ + 1;
                      local_59c = local_1448._0_4_ + 1;
                      local_590 = local_1460;
                      local_594 = local_1440;
                      local_5a0 = local_144c;
                      local_14d0 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_1440 - (int)local_1460[4]) +
                                     (long)(local_598 - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_59c - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_b78 = local_1468;
                      local_b88 = local_1450;
                      *(double *)
                       (*local_1468 +
                       ((long)(local_147c - (int)local_1468[4]) +
                        (long)(local_1480 - *(int *)((long)local_1468 + 0x24)) * local_1468[1] +
                        (long)(local_1484 - (int)local_1468[5]) * local_1468[2] +
                       (long)local_1450 * local_1468[3]) * 8) =
                           (local_14b0 * 64.0 +
                            (((local_1498 + local_14a8) - local_14c8) - local_14b8) * 8.0 +
                           (((local_1490 + local_14d0) - local_14c0) - local_14a0)) * 0.015625;
                      local_b9c = local_1484 + 1;
                      local_b90 = local_1468;
                      local_ba0 = local_1450;
                      *(double *)
                       (*local_1468 +
                       ((long)(local_147c - (int)local_1468[4]) +
                        (long)(local_1480 - *(int *)((long)local_1468 + 0x24)) * local_1468[1] +
                        (long)(local_b9c - (int)local_1468[5]) * local_1468[2] +
                       (long)local_1450 * local_1468[3]) * 8) =
                           (local_14b0 * 64.0 +
                            (((local_1498 + local_14b8) - local_14c8) - local_14a8) * 8.0 +
                           (((local_14c0 + local_14a0) - local_1490) - local_14d0)) * 0.015625;
                      local_bb0 = local_1480 + 1;
                      local_ba8 = local_1468;
                      local_bb8 = local_1450;
                      *(double *)
                       (*local_1468 +
                       ((long)(local_147c - (int)local_1468[4]) +
                        (long)(local_bb0 - *(int *)((long)local_1468 + 0x24)) * local_1468[1] +
                        (long)(local_1484 - (int)local_1468[5]) * local_1468[2] +
                       (long)local_1450 * local_1468[3]) * 8) =
                           (local_14b0 * 64.0 +
                            (((local_14c8 + local_14a8) - local_1498) - local_14b8) * 8.0 +
                           (((local_14c0 + local_14a0) - local_1490) - local_14d0)) * 0.015625;
                      local_bc8 = local_1480 + 1;
                      local_bcc = local_1484 + 1;
                      local_bc0 = local_1468;
                      local_bd0 = local_1450;
                      *(double *)
                       (*local_1468 +
                       ((long)(local_147c - (int)local_1468[4]) +
                        (long)(local_bc8 - *(int *)((long)local_1468 + 0x24)) * local_1468[1] +
                        (long)(local_bcc - (int)local_1468[5]) * local_1468[2] +
                       (long)local_1450 * local_1468[3]) * 8) =
                           (local_14b0 * 64.0 +
                            (((local_14c8 + local_14b8) - local_1498) - local_14a8) * 8.0 +
                           (((local_1490 + local_14d0) - local_14c0) - local_14a0)) * 0.015625;
                      local_bc4 = local_147c;
                      local_bb4 = local_1484;
                      local_bac = local_147c;
                      local_b98 = local_1480;
                      local_b94 = local_147c;
                      local_b84 = local_1484;
                      local_b80 = local_1480;
                      local_b7c = local_147c;
                    }
                    else if (local_1454 == 1) {
                      local_400._4_4_ = local_1440 + -1;
                      local_404 = local_1448._0_4_ + -1;
                      local_3f8 = local_1460;
                      local_400._0_4_ = (long)local_1448._4_4_;
                      local_408 = local_144c;
                      local_14d8 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_400._4_4_ - (int)local_1460[4]) +
                                     (long)(local_1448._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_404 - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_41c = local_1448._0_4_ + -1;
                      local_410 = local_1460;
                      local_418._4_4_ = local_1440;
                      local_418._0_4_ = (long)local_1448._4_4_;
                      local_420 = local_144c;
                      local_14e0 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_1440 - (int)local_1460[4]) +
                                     (long)(local_1448._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_41c - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_430._4_4_ = local_1440 + 1;
                      local_434 = local_1448._0_4_ + -1;
                      local_428 = local_1460;
                      local_430._0_4_ = (long)local_1448._4_4_;
                      local_438 = local_144c;
                      local_14e8 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_430._4_4_ - (int)local_1460[4]) +
                                     (long)(local_1448._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_434 - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_444 = local_1440 + -1;
                      local_440 = local_1460;
                      local_44c._4_4_ = local_1448._4_4_;
                      local_44c._0_4_ = local_1448._0_4_;
                      local_450 = local_144c;
                      local_14f0 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_444 - (int)local_1460[4]) +
                                     (long)(local_1448._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_1448._0_4_ - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_458 = local_1460;
                      local_45c = local_1440;
                      local_464._4_4_ = local_1448._4_4_;
                      local_464._0_4_ = local_1448._0_4_;
                      local_468 = local_144c;
                      local_14f8 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_1440 - (int)local_1460[4]) +
                                     (long)(local_1448._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_1448._0_4_ - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_474 = local_1440 + 1;
                      local_470 = local_1460;
                      local_47c._4_4_ = local_1448._4_4_;
                      local_47c._0_4_ = local_1448._0_4_;
                      local_480 = local_144c;
                      local_1500 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_474 - (int)local_1460[4]) +
                                     (long)(local_1448._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_1448._0_4_ - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_490._4_4_ = local_1440 + -1;
                      local_494 = local_1448._0_4_ + 1;
                      local_488 = local_1460;
                      local_490._0_4_ = (long)local_1448._4_4_;
                      local_498 = local_144c;
                      local_1508 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_490._4_4_ - (int)local_1460[4]) +
                                     (long)(local_1448._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_494 - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_4ac = local_1448._0_4_ + 1;
                      local_4a0 = local_1460;
                      local_4a8._4_4_ = local_1440;
                      local_4a8._0_4_ = (long)local_1448._4_4_;
                      local_4b0 = local_144c;
                      local_1510 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_1440 - (int)local_1460[4]) +
                                     (long)(local_1448._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_4ac - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_4c0._4_4_ = local_1440 + 1;
                      local_4c4 = local_1448._0_4_ + 1;
                      local_4b8 = local_1460;
                      local_4c0._0_4_ = (long)local_1448._4_4_;
                      local_4c8 = local_144c;
                      local_1518 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_4c0._4_4_ - (int)local_1460[4]) +
                                     (long)(local_1448._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_4c4 - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_b18 = local_1468;
                      local_b28 = local_1450;
                      *(double *)
                       (*local_1468 +
                       ((long)(local_147c - (int)local_1468[4]) +
                        (long)(local_1480 - *(int *)((long)local_1468 + 0x24)) * local_1468[1] +
                        (long)(local_1484 - (int)local_1468[5]) * local_1468[2] +
                       (long)local_1450 * local_1468[3]) * 8) =
                           (local_14f8 * 64.0 +
                            (((local_14e0 + local_14f0) - local_1510) - local_1500) * 8.0 +
                           (((local_14d8 + local_1518) - local_1508) - local_14e8)) * 0.015625;
                      local_b34 = local_147c + 1;
                      local_b30 = local_1468;
                      local_b40 = local_1450;
                      *(double *)
                       (*local_1468 +
                       ((long)(local_b34 - (int)local_1468[4]) +
                        (long)(local_1480 - *(int *)((long)local_1468 + 0x24)) * local_1468[1] +
                        (long)(local_1484 - (int)local_1468[5]) * local_1468[2] +
                       (long)local_1450 * local_1468[3]) * 8) =
                           (local_14f8 * 64.0 +
                            (((local_14e0 + local_1500) - local_1510) - local_14f0) * 8.0 +
                           (((local_1508 + local_14e8) - local_14d8) - local_1518)) * 0.015625;
                      local_b54 = local_1484 + 1;
                      local_b48 = local_1468;
                      local_b58 = local_1450;
                      *(double *)
                       (*local_1468 +
                       ((long)(local_147c - (int)local_1468[4]) +
                        (long)(local_1480 - *(int *)((long)local_1468 + 0x24)) * local_1468[1] +
                        (long)(local_b54 - (int)local_1468[5]) * local_1468[2] +
                       (long)local_1450 * local_1468[3]) * 8) =
                           (local_14f8 * 64.0 +
                            (((local_1510 + local_14f0) - local_14e0) - local_1500) * 8.0 +
                           (((local_1508 + local_14e8) - local_14d8) - local_1518)) * 0.015625;
                      local_b64 = local_147c + 1;
                      local_b6c = local_1484 + 1;
                      local_b60 = local_1468;
                      local_b70 = local_1450;
                      *(double *)
                       (*local_1468 +
                       ((long)(local_b64 - (int)local_1468[4]) +
                        (long)(local_1480 - *(int *)((long)local_1468 + 0x24)) * local_1468[1] +
                        (long)(local_b6c - (int)local_1468[5]) * local_1468[2] +
                       (long)local_1450 * local_1468[3]) * 8) =
                           (local_14f8 * 64.0 +
                            (((local_1510 + local_1500) - local_14e0) - local_14f0) * 8.0 +
                           (((local_14d8 + local_1518) - local_1508) - local_14e8)) * 0.015625;
                      local_b68 = local_1480;
                      local_b50 = local_1480;
                      local_b4c = local_147c;
                      local_b3c = local_1484;
                      local_b38 = local_1480;
                      local_b24 = local_1484;
                      local_b20 = local_1480;
                      local_b1c = local_147c;
                    }
                    else if (local_1454 == 2) {
                      local_324 = local_1440 + -1;
                      local_32c._4_4_ = local_1448._4_4_ + -1;
                      local_320 = local_1460;
                      local_32c._0_4_ = (long)local_1448._0_4_;
                      local_330 = local_144c;
                      local_1520 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_324 - (int)local_1460[4]) +
                                     (long)(local_32c._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_1448._0_4_ - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_344._4_4_ = local_1448._4_4_ + -1;
                      local_338 = local_1460;
                      local_33c = local_1440;
                      local_344._0_4_ = (long)local_1448._0_4_;
                      local_348 = local_144c;
                      local_1528 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_1440 - (int)local_1460[4]) +
                                     (long)(local_344._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_1448._0_4_ - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_354 = local_1440 + 1;
                      local_35c._4_4_ = local_1448._4_4_ + -1;
                      local_350 = local_1460;
                      local_35c._0_4_ = (long)local_1448._0_4_;
                      local_360 = local_144c;
                      local_1530 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_354 - (int)local_1460[4]) +
                                     (long)(local_35c._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_1448._0_4_ - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_36c = local_1440 + -1;
                      local_368 = local_1460;
                      local_374._4_4_ = local_1448._4_4_;
                      local_374._0_4_ = local_1448._0_4_;
                      local_378 = local_144c;
                      local_1538 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_36c - (int)local_1460[4]) +
                                     (long)(local_1448._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_1448._0_4_ - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_380 = local_1460;
                      local_384 = local_1440;
                      local_38c._4_4_ = local_1448._4_4_;
                      local_38c._0_4_ = local_1448._0_4_;
                      local_390 = local_144c;
                      local_1540 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_1440 - (int)local_1460[4]) +
                                     (long)(local_1448._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_1448._0_4_ - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_39c = local_1440 + 1;
                      local_398 = local_1460;
                      local_3a4._4_4_ = local_1448._4_4_;
                      local_3a4._0_4_ = local_1448._0_4_;
                      local_3a8 = local_144c;
                      local_1548 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_39c - (int)local_1460[4]) +
                                     (long)(local_1448._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_1448._0_4_ - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_3b4 = local_1440 + -1;
                      local_3bc._4_4_ = local_1448._4_4_ + 1;
                      local_3b0 = local_1460;
                      local_3bc._0_4_ = (long)local_1448._0_4_;
                      local_3c0 = local_144c;
                      local_1550 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_3b4 - (int)local_1460[4]) +
                                     (long)(local_3bc._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_1448._0_4_ - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_3d4._4_4_ = local_1448._4_4_ + 1;
                      local_3c8 = local_1460;
                      local_3cc = local_1440;
                      local_3d4._0_4_ = (long)local_1448._0_4_;
                      local_3d8 = local_144c;
                      local_1558 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_1440 - (int)local_1460[4]) +
                                     (long)(local_3d4._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_1448._0_4_ - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_3e4 = local_1440 + 1;
                      local_3ec._4_4_ = local_1448._4_4_ + 1;
                      local_3e0 = local_1460;
                      local_3ec._0_4_ = (long)local_1448._0_4_;
                      local_3f0 = local_144c;
                      local_1560 = *(double *)
                                    (*local_1460 +
                                    ((long)(local_3e4 - (int)local_1460[4]) +
                                     (long)(local_3ec._4_4_ - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                     (long)(local_1448._0_4_ - (int)local_1460[5]) * local_1460[2] +
                                    (long)local_144c * local_1460[3]) * 8);
                      local_ab8 = local_1468;
                      local_ac8 = local_1450;
                      *(double *)
                       (*local_1468 +
                       ((long)(local_147c - (int)local_1468[4]) +
                        (long)(local_1480 - *(int *)((long)local_1468 + 0x24)) * local_1468[1] +
                        (long)(local_1484 - (int)local_1468[5]) * local_1468[2] +
                       (long)local_1450 * local_1468[3]) * 8) =
                           (local_1540 * 64.0 +
                            (((local_1528 + local_1538) - local_1558) - local_1548) * 8.0 +
                           (((local_1520 + local_1560) - local_1550) - local_1530)) * 0.015625;
                      local_ad4 = local_147c + 1;
                      local_ad0 = local_1468;
                      local_ae0 = local_1450;
                      *(double *)
                       (*local_1468 +
                       ((long)(local_ad4 - (int)local_1468[4]) +
                        (long)(local_1480 - *(int *)((long)local_1468 + 0x24)) * local_1468[1] +
                        (long)(local_1484 - (int)local_1468[5]) * local_1468[2] +
                       (long)local_1450 * local_1468[3]) * 8) =
                           (local_1540 * 64.0 +
                            (((local_1528 + local_1548) - local_1558) - local_1538) * 8.0 +
                           (((local_1550 + local_1530) - local_1520) - local_1560)) * 0.015625;
                      local_af0 = local_1480 + 1;
                      local_ae8 = local_1468;
                      local_af8 = local_1450;
                      *(double *)
                       (*local_1468 +
                       ((long)(local_147c - (int)local_1468[4]) +
                        (long)(local_af0 - *(int *)((long)local_1468 + 0x24)) * local_1468[1] +
                        (long)(local_1484 - (int)local_1468[5]) * local_1468[2] +
                       (long)local_1450 * local_1468[3]) * 8) =
                           (local_1540 * 64.0 +
                            (((local_1558 + local_1538) - local_1528) - local_1548) * 8.0 +
                           (((local_1550 + local_1530) - local_1520) - local_1560)) * 0.015625;
                      local_b04 = local_147c + 1;
                      local_b08 = local_1480 + 1;
                      local_b00 = local_1468;
                      local_b10 = local_1450;
                      *(double *)
                       (*local_1468 +
                       ((long)(local_b04 - (int)local_1468[4]) +
                        (long)(local_b08 - *(int *)((long)local_1468 + 0x24)) * local_1468[1] +
                        (long)(local_1484 - (int)local_1468[5]) * local_1468[2] +
                       (long)local_1450 * local_1468[3]) * 8) =
                           (local_1540 * 64.0 +
                            (((local_1558 + local_1548) - local_1528) - local_1538) * 8.0 +
                           (((local_1520 + local_1560) - local_1550) - local_1530)) * 0.015625;
                      local_b0c = local_1484;
                      local_af4 = local_1484;
                      local_aec = local_147c;
                      local_adc = local_1484;
                      local_ad8 = local_1480;
                      local_ac4 = local_1484;
                      local_ac0 = local_1480;
                      local_abc = local_147c;
                    }
                  }
                }
                iVar4 = local_1e74 + 1;
              }
              lVar3 = (long)((int)(long)local_1e70 + 1);
            }
            local_1e70._4_4_ = (long)((int)local_1e70._4_4_ + 1);
          } while( true );
        }
        for (; local_1d44._4_4_ = uVar15, local_1d4c._4_4_ = iVar11, local_1d60._4_4_ = uVar13,
            local_1d68._4_4_ = iVar1, local_1d7c._4_4_ = (undefined4)auVar22._4_4_,
            local_1d84._4_4_ = iVar20, uVar14 = local_1d44._4_4_, iVar11 = local_1d4c._4_4_,
            uVar15 = local_1d60._4_4_, iVar1 = local_1d68._4_4_, uVar13 = local_1d7c._4_4_,
            iVar20 = local_1d84._4_4_, local_1e24 = iVar2, (int)local_1e20._0_4_ <= (long)auVar5;
            local_1e20._0_4_ = local_1e20._0_4_ + 1) {
          for (; local_1d44._4_4_ = uVar14, local_1d4c._4_4_ = iVar11, local_1d60._4_4_ = uVar15,
              local_1d68._4_4_ = iVar1, local_1d7c._4_4_ = uVar13, local_1d84._4_4_ = iVar20,
              uVar15 = local_1d44._4_4_, iVar11 = local_1d4c._4_4_, uVar13 = local_1d60._4_4_,
              iVar1 = local_1d68._4_4_, auVar22._4_4_ = (long)local_1d7c._4_4_,
              iVar20 = local_1d84._4_4_, local_1e24 <= iVar10; local_1e24 = local_1e24 + 1) {
            lVar3 = local_1d84;
            auVar22 = local_1d7c;
            lVar6 = local_1d68;
            auVar7 = local_1d60;
            lVar8 = local_1d4c;
            auVar9 = local_1d44;
            local_1d84._4_4_ = iVar20;
            local_1d7c._4_4_ = (undefined4)auVar22._4_4_;
            local_1d68._4_4_ = iVar1;
            local_1d60._4_4_ = uVar13;
            local_1d4c._4_4_ = iVar11;
            local_1d44._4_4_ = uVar15;
            for (local_1e28 = 0; local_1d44 = auVar9, local_1d4c = lVar8, local_1d60 = auVar7,
                local_1d68 = lVar6, local_1d7c = auVar22, local_1d84 = lVar3,
                uVar14 = local_1d44._4_4_, iVar11 = local_1d4c._4_4_, uVar15 = local_1d60._4_4_,
                iVar1 = local_1d68._4_4_, uVar13 = local_1d7c._4_4_, iVar20 = local_1d84._4_4_,
                local_1e28 < local_19e8; local_1e28 = local_1e28 + 1) {
              local_12fc = local_19d4 + local_1e28;
              local_1300 = local_19e4 + local_1e28;
              local_18d8 = &local_1af0;
              local_18dc = 1;
              local_1310 = local_1ab0;
              local_1898 = local_1bb0;
              local_189c = 1;
              local_1318 = local_1b70;
              local_1808 = local_1c70;
              local_180c = 1;
              local_1320 = local_1c30;
              local_12f0 = local_1e24;
              local_12f8._4_4_ = local_1e20._0_4_;
              local_12f8._0_4_ = local_1e20._4_4_;
              local_1304 = 1;
              local_1328 = in_stack_00000010;
              unique0x10007bc0 = local_1d84;
              local_1d84._4_4_ = iVar20;
              auVar22 = local_1d7c;
              local_1d7c._4_4_ = uVar13;
              lVar3 = local_1d68;
              local_1d68._4_4_ = iVar1;
              auVar7 = local_1d60;
              local_1d60._4_4_ = uVar15;
              lVar6 = local_1d4c;
              local_1d4c._4_4_ = iVar11;
              auVar9 = local_1d44;
              local_1d44._4_4_ = uVar14;
              bVar16 = Array4::operator_cast_to_bool(local_1320);
              auVar9 = local_1d44;
              lVar8 = local_1d4c;
              auVar7 = local_1d60;
              lVar6 = local_1d68;
              auVar22 = local_1d7c;
              lVar3 = local_1d84;
              if (bVar16) {
                local_20 = local_1320;
                local_24 = local_12f0;
                local_2c._4_4_ = local_12f8._4_4_;
                local_2c._0_4_ = local_12f8._0_4_;
                local_30 = local_12fc;
                if (*(int *)(*(long *)local_1320 +
                            ((long)(local_12f0 - *(int *)(local_1320 + 0x20)) +
                             (long)(local_12f8._4_4_ - *(int *)(local_1320 + 0x24)) *
                             *(long *)(local_1320 + 8) +
                             (long)(local_12f8._0_4_ - *(int *)(local_1320 + 0x28)) *
                             *(long *)(local_1320 + 0x10) +
                            (long)local_12fc * *(long *)(local_1320 + 0x18)) * 4) != 0)
                goto LAB_0133e37a;
              }
              else {
LAB_0133e37a:
                local_12c8 = local_1328;
                local_12cc = 0;
                local_132c = local_12f0 * *local_1328;
                local_12d8 = local_1328;
                local_12dc = 1;
                local_1330 = local_12f8._4_4_ * local_1328[1];
                local_12e8 = local_1328;
                local_12ec = 2;
                local_1334 = local_12f8._0_4_ * local_1328[2];
                if (local_1304 == 0) {
                  local_760 = local_12f8._4_4_ + -1;
                  local_764 = local_12f8._0_4_ + -1;
                  local_758 = local_1310;
                  local_75c = local_12f0;
                  local_768 = local_12fc;
                  local_1340 = *(double *)
                                (*local_1310 +
                                ((long)(local_12f0 - (int)local_1310[4]) +
                                 (long)(local_760 - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_764 - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_77c._4_4_ = local_12f8._4_4_ + -1;
                  local_770 = local_1310;
                  local_774 = local_12f0;
                  local_77c._0_4_ = (long)local_12f8._0_4_;
                  local_780 = local_12fc;
                  local_1348 = *(double *)
                                (*local_1310 +
                                ((long)(local_12f0 - (int)local_1310[4]) +
                                 (long)(local_77c._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_12f8._0_4_ - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_790 = local_12f8._4_4_ + -1;
                  local_794 = local_12f8._0_4_ + 1;
                  local_788 = local_1310;
                  local_78c = local_12f0;
                  local_798 = local_12fc;
                  local_1350 = *(double *)
                                (*local_1310 +
                                ((long)(local_12f0 - (int)local_1310[4]) +
                                 (long)(local_790 - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_794 - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_7ac = local_12f8._0_4_ + -1;
                  local_7a0 = local_1310;
                  local_7a8._4_4_ = local_12f0;
                  local_7a8._0_4_ = (long)local_12f8._4_4_;
                  local_7b0 = local_12fc;
                  local_1358 = *(double *)
                                (*local_1310 +
                                ((long)(local_12f0 - (int)local_1310[4]) +
                                 (long)(local_12f8._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_7ac - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_7b8 = local_1310;
                  local_7bc = local_12f0;
                  local_7c4._4_4_ = local_12f8._4_4_;
                  local_7c4._0_4_ = local_12f8._0_4_;
                  local_7c8 = local_12fc;
                  local_1360 = *(double *)
                                (*local_1310 +
                                ((long)(local_12f0 - (int)local_1310[4]) +
                                 (long)(local_12f8._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_12f8._0_4_ - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_7dc = local_12f8._0_4_ + 1;
                  local_7d0 = local_1310;
                  local_7d8._4_4_ = local_12f0;
                  local_7d8._0_4_ = (long)local_12f8._4_4_;
                  local_7e0 = local_12fc;
                  local_1368 = *(double *)
                                (*local_1310 +
                                ((long)(local_12f0 - (int)local_1310[4]) +
                                 (long)(local_12f8._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_7dc - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_7f0 = local_12f8._4_4_ + 1;
                  local_7f4 = local_12f8._0_4_ + -1;
                  local_7e8 = local_1310;
                  local_7ec = local_12f0;
                  local_7f8 = local_12fc;
                  local_1370 = *(double *)
                                (*local_1310 +
                                ((long)(local_12f0 - (int)local_1310[4]) +
                                 (long)(local_7f0 - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_7f4 - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_80c._4_4_ = local_12f8._4_4_ + 1;
                  local_800 = local_1310;
                  local_804 = local_12f0;
                  local_80c._0_4_ = (long)local_12f8._0_4_;
                  local_810 = local_12fc;
                  local_1378 = *(double *)
                                (*local_1310 +
                                ((long)(local_12f0 - (int)local_1310[4]) +
                                 (long)(local_80c._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_12f8._0_4_ - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_820 = local_12f8._4_4_ + 1;
                  local_824 = local_12f8._0_4_ + 1;
                  local_818 = local_1310;
                  local_81c = local_12f0;
                  local_828 = local_12fc;
                  local_1380 = *(double *)
                                (*local_1310 +
                                ((long)(local_12f0 - (int)local_1310[4]) +
                                 (long)(local_820 - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_824 - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_c98 = local_1318;
                  local_ca8 = local_1300;
                  *(double *)
                   (*local_1318 +
                   ((long)(local_132c - (int)local_1318[4]) +
                    (long)(local_1330 - *(int *)((long)local_1318 + 0x24)) * local_1318[1] +
                    (long)(local_1334 - (int)local_1318[5]) * local_1318[2] +
                   (long)local_1300 * local_1318[3]) * 8) =
                       (local_1360 * 64.0 +
                        (((local_1348 + local_1358) - local_1378) - local_1368) * 8.0 +
                       (((local_1340 + local_1380) - local_1370) - local_1350)) * 0.015625;
                  local_cbc = local_1334 + 1;
                  local_cb0 = local_1318;
                  local_cc0 = local_1300;
                  *(double *)
                   (*local_1318 +
                   ((long)(local_132c - (int)local_1318[4]) +
                    (long)(local_1330 - *(int *)((long)local_1318 + 0x24)) * local_1318[1] +
                    (long)(local_cbc - (int)local_1318[5]) * local_1318[2] +
                   (long)local_1300 * local_1318[3]) * 8) =
                       (local_1360 * 64.0 +
                        (((local_1348 + local_1368) - local_1378) - local_1358) * 8.0 +
                       (((local_1370 + local_1350) - local_1340) - local_1380)) * 0.015625;
                  local_cd0 = local_1330 + 1;
                  local_cc8 = local_1318;
                  local_cd8 = local_1300;
                  *(double *)
                   (*local_1318 +
                   ((long)(local_132c - (int)local_1318[4]) +
                    (long)(local_cd0 - *(int *)((long)local_1318 + 0x24)) * local_1318[1] +
                    (long)(local_1334 - (int)local_1318[5]) * local_1318[2] +
                   (long)local_1300 * local_1318[3]) * 8) =
                       (local_1360 * 64.0 +
                        (((local_1378 + local_1358) - local_1348) - local_1368) * 8.0 +
                       (((local_1370 + local_1350) - local_1340) - local_1380)) * 0.015625;
                  local_ce8 = local_1330 + 1;
                  local_cec = local_1334 + 1;
                  local_ce0 = local_1318;
                  local_cf0 = local_1300;
                  *(double *)
                   (*local_1318 +
                   ((long)(local_132c - (int)local_1318[4]) +
                    (long)(local_ce8 - *(int *)((long)local_1318 + 0x24)) * local_1318[1] +
                    (long)(local_cec - (int)local_1318[5]) * local_1318[2] +
                   (long)local_1300 * local_1318[3]) * 8) =
                       (local_1360 * 64.0 +
                        (((local_1378 + local_1368) - local_1348) - local_1358) * 8.0 +
                       (((local_1340 + local_1380) - local_1370) - local_1350)) * 0.015625;
                  local_ce4 = local_132c;
                  local_cd4 = local_1334;
                  local_ccc = local_132c;
                  local_cb8 = local_1330;
                  local_cb4 = local_132c;
                  local_ca4 = local_1334;
                  local_ca0 = local_1330;
                  local_c9c = local_132c;
                }
                else if (local_1304 == 1) {
                  local_688._4_4_ = local_12f0 + -1;
                  local_68c = local_12f8._0_4_ + -1;
                  local_680 = local_1310;
                  local_688._0_4_ = (long)local_12f8._4_4_;
                  local_690 = local_12fc;
                  local_1388 = *(double *)
                                (*local_1310 +
                                ((long)(local_688._4_4_ - (int)local_1310[4]) +
                                 (long)(local_12f8._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_68c - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_6a4 = local_12f8._0_4_ + -1;
                  local_698 = local_1310;
                  local_6a0._4_4_ = local_12f0;
                  local_6a0._0_4_ = (long)local_12f8._4_4_;
                  local_6a8 = local_12fc;
                  local_1390 = *(double *)
                                (*local_1310 +
                                ((long)(local_12f0 - (int)local_1310[4]) +
                                 (long)(local_12f8._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_6a4 - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_6b8._4_4_ = local_12f0 + 1;
                  local_6bc = local_12f8._0_4_ + -1;
                  local_6b0 = local_1310;
                  local_6b8._0_4_ = (long)local_12f8._4_4_;
                  local_6c0 = local_12fc;
                  local_1398 = *(double *)
                                (*local_1310 +
                                ((long)(local_6b8._4_4_ - (int)local_1310[4]) +
                                 (long)(local_12f8._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_6bc - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_6cc = local_12f0 + -1;
                  local_6c8 = local_1310;
                  local_6d4._4_4_ = local_12f8._4_4_;
                  local_6d4._0_4_ = local_12f8._0_4_;
                  local_6d8 = local_12fc;
                  local_13a0 = *(double *)
                                (*local_1310 +
                                ((long)(local_6cc - (int)local_1310[4]) +
                                 (long)(local_12f8._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_12f8._0_4_ - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_6e0 = local_1310;
                  local_6e4 = local_12f0;
                  local_6ec._4_4_ = local_12f8._4_4_;
                  local_6ec._0_4_ = local_12f8._0_4_;
                  local_6f0 = local_12fc;
                  local_13a8 = *(double *)
                                (*local_1310 +
                                ((long)(local_12f0 - (int)local_1310[4]) +
                                 (long)(local_12f8._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_12f8._0_4_ - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_6fc = local_12f0 + 1;
                  local_6f8 = local_1310;
                  local_704._4_4_ = local_12f8._4_4_;
                  local_704._0_4_ = local_12f8._0_4_;
                  local_708 = local_12fc;
                  local_13b0 = *(double *)
                                (*local_1310 +
                                ((long)(local_6fc - (int)local_1310[4]) +
                                 (long)(local_12f8._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_12f8._0_4_ - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_718._4_4_ = local_12f0 + -1;
                  local_71c = local_12f8._0_4_ + 1;
                  local_710 = local_1310;
                  local_718._0_4_ = (long)local_12f8._4_4_;
                  local_720 = local_12fc;
                  local_13b8 = *(double *)
                                (*local_1310 +
                                ((long)(local_718._4_4_ - (int)local_1310[4]) +
                                 (long)(local_12f8._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_71c - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_734 = local_12f8._0_4_ + 1;
                  local_728 = local_1310;
                  local_730._4_4_ = local_12f0;
                  local_730._0_4_ = (long)local_12f8._4_4_;
                  local_738 = local_12fc;
                  local_13c0 = *(double *)
                                (*local_1310 +
                                ((long)(local_12f0 - (int)local_1310[4]) +
                                 (long)(local_12f8._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_734 - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_748._4_4_ = local_12f0 + 1;
                  local_74c = local_12f8._0_4_ + 1;
                  local_740 = local_1310;
                  local_748._0_4_ = (long)local_12f8._4_4_;
                  local_750 = local_12fc;
                  local_13c8 = *(double *)
                                (*local_1310 +
                                ((long)(local_748._4_4_ - (int)local_1310[4]) +
                                 (long)(local_12f8._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_74c - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_c38 = local_1318;
                  local_c48 = local_1300;
                  *(double *)
                   (*local_1318 +
                   ((long)(local_132c - (int)local_1318[4]) +
                    (long)(local_1330 - *(int *)((long)local_1318 + 0x24)) * local_1318[1] +
                    (long)(local_1334 - (int)local_1318[5]) * local_1318[2] +
                   (long)local_1300 * local_1318[3]) * 8) =
                       (local_13a8 * 64.0 +
                        (((local_1390 + local_13a0) - local_13c0) - local_13b0) * 8.0 +
                       (((local_1388 + local_13c8) - local_13b8) - local_1398)) * 0.015625;
                  local_c54 = local_132c + 1;
                  local_c50 = local_1318;
                  local_c60 = local_1300;
                  *(double *)
                   (*local_1318 +
                   ((long)(local_c54 - (int)local_1318[4]) +
                    (long)(local_1330 - *(int *)((long)local_1318 + 0x24)) * local_1318[1] +
                    (long)(local_1334 - (int)local_1318[5]) * local_1318[2] +
                   (long)local_1300 * local_1318[3]) * 8) =
                       (local_13a8 * 64.0 +
                        (((local_1390 + local_13b0) - local_13c0) - local_13a0) * 8.0 +
                       (((local_13b8 + local_1398) - local_1388) - local_13c8)) * 0.015625;
                  local_c74 = local_1334 + 1;
                  local_c68 = local_1318;
                  local_c78 = local_1300;
                  *(double *)
                   (*local_1318 +
                   ((long)(local_132c - (int)local_1318[4]) +
                    (long)(local_1330 - *(int *)((long)local_1318 + 0x24)) * local_1318[1] +
                    (long)(local_c74 - (int)local_1318[5]) * local_1318[2] +
                   (long)local_1300 * local_1318[3]) * 8) =
                       (local_13a8 * 64.0 +
                        (((local_13c0 + local_13a0) - local_1390) - local_13b0) * 8.0 +
                       (((local_13b8 + local_1398) - local_1388) - local_13c8)) * 0.015625;
                  local_c84 = local_132c + 1;
                  local_c8c = local_1334 + 1;
                  local_c80 = local_1318;
                  local_c90 = local_1300;
                  *(double *)
                   (*local_1318 +
                   ((long)(local_c84 - (int)local_1318[4]) +
                    (long)(local_1330 - *(int *)((long)local_1318 + 0x24)) * local_1318[1] +
                    (long)(local_c8c - (int)local_1318[5]) * local_1318[2] +
                   (long)local_1300 * local_1318[3]) * 8) =
                       (local_13a8 * 64.0 +
                        (((local_13c0 + local_13b0) - local_1390) - local_13a0) * 8.0 +
                       (((local_1388 + local_13c8) - local_13b8) - local_1398)) * 0.015625;
                  local_c88 = local_1330;
                  local_c70 = local_1330;
                  local_c6c = local_132c;
                  local_c5c = local_1334;
                  local_c58 = local_1330;
                  local_c44 = local_1334;
                  local_c40 = local_1330;
                  local_c3c = local_132c;
                }
                else if (local_1304 == 2) {
                  local_5ac = local_12f0 + -1;
                  local_5b4._4_4_ = local_12f8._4_4_ + -1;
                  local_5a8 = local_1310;
                  local_5b4._0_4_ = (long)local_12f8._0_4_;
                  local_5b8 = local_12fc;
                  local_13d0 = *(double *)
                                (*local_1310 +
                                ((long)(local_5ac - (int)local_1310[4]) +
                                 (long)(local_5b4._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_12f8._0_4_ - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_5cc._4_4_ = local_12f8._4_4_ + -1;
                  local_5c0 = local_1310;
                  local_5c4 = local_12f0;
                  local_5cc._0_4_ = (long)local_12f8._0_4_;
                  local_5d0 = local_12fc;
                  local_13d8 = *(double *)
                                (*local_1310 +
                                ((long)(local_12f0 - (int)local_1310[4]) +
                                 (long)(local_5cc._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_12f8._0_4_ - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_5dc = local_12f0 + 1;
                  local_5e4._4_4_ = local_12f8._4_4_ + -1;
                  local_5d8 = local_1310;
                  local_5e4._0_4_ = (long)local_12f8._0_4_;
                  local_5e8 = local_12fc;
                  local_13e0 = *(double *)
                                (*local_1310 +
                                ((long)(local_5dc - (int)local_1310[4]) +
                                 (long)(local_5e4._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_12f8._0_4_ - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_5f4 = local_12f0 + -1;
                  local_5f0 = local_1310;
                  local_5fc._4_4_ = local_12f8._4_4_;
                  local_5fc._0_4_ = local_12f8._0_4_;
                  local_600 = local_12fc;
                  local_13e8 = *(double *)
                                (*local_1310 +
                                ((long)(local_5f4 - (int)local_1310[4]) +
                                 (long)(local_12f8._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_12f8._0_4_ - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_608 = local_1310;
                  local_60c = local_12f0;
                  local_614._4_4_ = local_12f8._4_4_;
                  local_614._0_4_ = local_12f8._0_4_;
                  local_618 = local_12fc;
                  local_13f0 = *(double *)
                                (*local_1310 +
                                ((long)(local_12f0 - (int)local_1310[4]) +
                                 (long)(local_12f8._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_12f8._0_4_ - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_624 = local_12f0 + 1;
                  local_620 = local_1310;
                  local_62c._4_4_ = local_12f8._4_4_;
                  local_62c._0_4_ = local_12f8._0_4_;
                  local_630 = local_12fc;
                  local_13f8 = *(double *)
                                (*local_1310 +
                                ((long)(local_624 - (int)local_1310[4]) +
                                 (long)(local_12f8._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_12f8._0_4_ - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_63c = local_12f0 + -1;
                  local_644._4_4_ = local_12f8._4_4_ + 1;
                  local_638 = local_1310;
                  local_644._0_4_ = (long)local_12f8._0_4_;
                  local_648 = local_12fc;
                  local_1400 = *(double *)
                                (*local_1310 +
                                ((long)(local_63c - (int)local_1310[4]) +
                                 (long)(local_644._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_12f8._0_4_ - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_65c._4_4_ = local_12f8._4_4_ + 1;
                  local_650 = local_1310;
                  local_654 = local_12f0;
                  local_65c._0_4_ = (long)local_12f8._0_4_;
                  local_660 = local_12fc;
                  local_1408 = *(double *)
                                (*local_1310 +
                                ((long)(local_12f0 - (int)local_1310[4]) +
                                 (long)(local_65c._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_12f8._0_4_ - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_66c = local_12f0 + 1;
                  local_674._4_4_ = local_12f8._4_4_ + 1;
                  local_668 = local_1310;
                  local_674._0_4_ = (long)local_12f8._0_4_;
                  local_678 = local_12fc;
                  local_1410 = *(double *)
                                (*local_1310 +
                                ((long)(local_66c - (int)local_1310[4]) +
                                 (long)(local_674._4_4_ - *(int *)((long)local_1310 + 0x24)) *
                                 local_1310[1] +
                                 (long)(local_12f8._0_4_ - (int)local_1310[5]) * local_1310[2] +
                                (long)local_12fc * local_1310[3]) * 8);
                  local_bd8 = local_1318;
                  local_be8 = local_1300;
                  *(double *)
                   (*local_1318 +
                   ((long)(local_132c - (int)local_1318[4]) +
                    (long)(local_1330 - *(int *)((long)local_1318 + 0x24)) * local_1318[1] +
                    (long)(local_1334 - (int)local_1318[5]) * local_1318[2] +
                   (long)local_1300 * local_1318[3]) * 8) =
                       (local_13f0 * 64.0 +
                        (((local_13d8 + local_13e8) - local_1408) - local_13f8) * 8.0 +
                       (((local_13d0 + local_1410) - local_1400) - local_13e0)) * 0.015625;
                  local_bf4 = local_132c + 1;
                  local_bf0 = local_1318;
                  local_c00 = local_1300;
                  *(double *)
                   (*local_1318 +
                   ((long)(local_bf4 - (int)local_1318[4]) +
                    (long)(local_1330 - *(int *)((long)local_1318 + 0x24)) * local_1318[1] +
                    (long)(local_1334 - (int)local_1318[5]) * local_1318[2] +
                   (long)local_1300 * local_1318[3]) * 8) =
                       (local_13f0 * 64.0 +
                        (((local_13d8 + local_13f8) - local_1408) - local_13e8) * 8.0 +
                       (((local_1400 + local_13e0) - local_13d0) - local_1410)) * 0.015625;
                  local_c10 = local_1330 + 1;
                  local_c08 = local_1318;
                  local_c18 = local_1300;
                  *(double *)
                   (*local_1318 +
                   ((long)(local_132c - (int)local_1318[4]) +
                    (long)(local_c10 - *(int *)((long)local_1318 + 0x24)) * local_1318[1] +
                    (long)(local_1334 - (int)local_1318[5]) * local_1318[2] +
                   (long)local_1300 * local_1318[3]) * 8) =
                       (local_13f0 * 64.0 +
                        (((local_1408 + local_13e8) - local_13d8) - local_13f8) * 8.0 +
                       (((local_1400 + local_13e0) - local_13d0) - local_1410)) * 0.015625;
                  local_c24 = local_132c + 1;
                  local_c28 = local_1330 + 1;
                  local_c20 = local_1318;
                  local_c30 = local_1300;
                  *(double *)
                   (*local_1318 +
                   ((long)(local_c24 - (int)local_1318[4]) +
                    (long)(local_c28 - *(int *)((long)local_1318 + 0x24)) * local_1318[1] +
                    (long)(local_1334 - (int)local_1318[5]) * local_1318[2] +
                   (long)local_1300 * local_1318[3]) * 8) =
                       (local_13f0 * 64.0 +
                        (((local_1408 + local_13f8) - local_13d8) - local_13e8) * 8.0 +
                       (((local_13d0 + local_1410) - local_1400) - local_13e0)) * 0.015625;
                  local_c2c = local_1334;
                  local_c14 = local_1334;
                  local_c0c = local_132c;
                  local_bfc = local_1334;
                  local_bf8 = local_1330;
                  local_be4 = local_1334;
                  local_be0 = local_1330;
                  local_bdc = local_132c;
                }
              }
            }
          }
        }
        local_1e20._4_4_ = local_1e20._4_4_ + 1;
      } while( true );
    }
    for (; local_1d44._4_4_ = uVar14, local_1d4c._4_4_ = iVar11, local_1d60._4_4_ = uVar12,
        local_1d68._4_4_ = iVar10, local_1d7c._4_4_ = uVar13, local_1d84._4_4_ = iVar20,
        uVar12 = local_1d44._4_4_, iVar10 = local_1d4c._4_4_, uVar13 = local_1d60._4_4_,
        iVar20 = local_1d68._4_4_, uVar14 = local_1d7c._4_4_, iVar11 = local_1d84._4_4_,
        local_1dd4 = iVar1, (int)local_1dd0._0_4_ <= (long)auVar22;
        local_1dd0._0_4_ = local_1dd0._0_4_ + 1) {
      for (; local_1d44._4_4_ = uVar12, local_1d4c._4_4_ = iVar10, local_1d60._4_4_ = uVar13,
          local_1d68._4_4_ = iVar20, local_1d7c._4_4_ = uVar14, local_1d84._4_4_ = iVar11,
          uVar14 = local_1d44._4_4_, iVar11 = local_1d4c._4_4_, uVar12 = local_1d60._4_4_,
          iVar10 = local_1d68._4_4_, uVar13 = local_1d7c._4_4_, iVar20 = local_1d84._4_4_,
          local_1dd4 <= iVar2; local_1dd4 = local_1dd4 + 1) {
        unique0x100074f0 = local_1d84;
        auVar5 = local_1d7c;
        lVar3 = local_1d68;
        auVar7 = local_1d60;
        lVar6 = local_1d4c;
        auVar9 = local_1d44;
        local_1d84._4_4_ = iVar20;
        local_1d7c._4_4_ = uVar13;
        local_1d68._4_4_ = iVar10;
        local_1d60._4_4_ = uVar12;
        local_1d4c._4_4_ = iVar11;
        local_1d44._4_4_ = uVar14;
        for (local_1dd8 = 0; local_1d44 = auVar9, local_1d4c = lVar6, local_1d60 = auVar7,
            local_1d68 = lVar3, local_1d7c = auVar5, local_1d84 = unique0x10007500,
            uVar12 = local_1d44._4_4_, iVar10 = local_1d4c._4_4_, uVar13 = local_1d60._4_4_,
            iVar20 = local_1d68._4_4_, uVar14 = local_1d7c._4_4_, iVar11 = local_1d84._4_4_,
            local_1dd8 < local_19e8; local_1dd8 = local_1dd8 + 1) {
          local_11ac = local_19d4 + local_1dd8;
          local_11b0 = local_19e4 + local_1dd8;
          local_18c8 = &local_1af0;
          local_18cc = 0;
          local_1888 = local_1bb0;
          local_188c = 0;
          local_17f8 = local_1c70;
          local_17fc = 0;
          local_11a0 = local_1dd4;
          local_11a8._4_4_ = local_1dd0._0_4_;
          local_11a8._0_4_ = local_1dd0._4_4_;
          local_11b4 = 0;
          local_11d8 = in_stack_00000010;
          local_11d0 = local_17f8;
          local_11c8 = local_1888;
          local_11c0 = local_18c8;
          unique0x10007bcc = local_1d84;
          local_1d84._4_4_ = iVar11;
          auVar5 = local_1d7c;
          local_1d7c._4_4_ = uVar14;
          lVar3 = local_1d68;
          local_1d68._4_4_ = iVar20;
          auVar7 = local_1d60;
          local_1d60._4_4_ = uVar13;
          lVar6 = local_1d4c;
          local_1d4c._4_4_ = iVar10;
          auVar9 = local_1d44;
          local_1d44._4_4_ = uVar12;
          bVar16 = Array4::operator_cast_to_bool(local_17f8);
          auVar9 = local_1d44;
          lVar6 = local_1d4c;
          auVar7 = local_1d60;
          lVar3 = local_1d68;
          auVar5 = local_1d7c;
          unique0x100070f0 = local_1d84;
          if (bVar16) {
            local_38 = local_11d0;
            local_3c = local_11a0;
            local_44._4_4_ = local_11a8._4_4_;
            local_44._0_4_ = local_11a8._0_4_;
            local_48 = local_11ac;
            if (*(int *)(*(long *)local_11d0 +
                        ((long)(local_11a0 - *(int *)(local_11d0 + 0x20)) +
                         (long)(local_11a8._4_4_ - *(int *)(local_11d0 + 0x24)) *
                         *(long *)(local_11d0 + 8) +
                         (long)(local_11a8._0_4_ - *(int *)(local_11d0 + 0x28)) *
                         *(long *)(local_11d0 + 0x10) +
                        (long)local_11ac * *(long *)(local_11d0 + 0x18)) * 4) != 0)
            goto LAB_0133be0b;
          }
          else {
LAB_0133be0b:
            local_1178 = local_11d8;
            local_117c = 0;
            local_11dc = local_11a0 * *local_11d8;
            local_1188 = local_11d8;
            local_118c = 1;
            local_11e0 = local_11a8._4_4_ * local_11d8[1];
            local_1198 = local_11d8;
            local_119c = 2;
            local_11e4 = local_11a8._0_4_ * local_11d8[2];
            if (local_11b4 == 0) {
              local_9e8 = local_11a8._4_4_ + -1;
              local_9ec = local_11a8._0_4_ + -1;
              local_9e0 = local_11c0;
              local_9e4 = local_11a0;
              local_9f0 = local_11ac;
              local_11f0 = *(double *)
                            (*local_11c0 +
                            ((long)(local_11a0 - (int)local_11c0[4]) +
                             (long)(local_9e8 - *(int *)((long)local_11c0 + 0x24)) * local_11c0[1] +
                             (long)(local_9ec - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_a04._4_4_ = local_11a8._4_4_ + -1;
              local_9f8 = local_11c0;
              local_9fc = local_11a0;
              local_a04._0_4_ = (long)local_11a8._0_4_;
              local_a08 = local_11ac;
              local_11f8 = *(double *)
                            (*local_11c0 +
                            ((long)(local_11a0 - (int)local_11c0[4]) +
                             (long)(local_a04._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] +
                             (long)(local_11a8._0_4_ - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_a18 = local_11a8._4_4_ + -1;
              local_a1c = local_11a8._0_4_ + 1;
              local_a10 = local_11c0;
              local_a14 = local_11a0;
              local_a20 = local_11ac;
              local_1200 = *(double *)
                            (*local_11c0 +
                            ((long)(local_11a0 - (int)local_11c0[4]) +
                             (long)(local_a18 - *(int *)((long)local_11c0 + 0x24)) * local_11c0[1] +
                             (long)(local_a1c - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_a34 = local_11a8._0_4_ + -1;
              local_a28 = local_11c0;
              local_a30._4_4_ = local_11a0;
              local_a30._0_4_ = (long)local_11a8._4_4_;
              local_a38 = local_11ac;
              local_1208 = *(double *)
                            (*local_11c0 +
                            ((long)(local_11a0 - (int)local_11c0[4]) +
                             (long)(local_11a8._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] + (long)(local_a34 - (int)local_11c0[5]) * local_11c0[2]
                            + (long)local_11ac * local_11c0[3]) * 8);
              local_a40 = local_11c0;
              local_a44 = local_11a0;
              local_a4c._4_4_ = local_11a8._4_4_;
              local_a4c._0_4_ = local_11a8._0_4_;
              local_a50 = local_11ac;
              local_1210 = *(double *)
                            (*local_11c0 +
                            ((long)(local_11a0 - (int)local_11c0[4]) +
                             (long)(local_11a8._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] +
                             (long)(local_11a8._0_4_ - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_a64 = local_11a8._0_4_ + 1;
              local_a58 = local_11c0;
              local_a60._4_4_ = local_11a0;
              local_a60._0_4_ = (long)local_11a8._4_4_;
              local_a68 = local_11ac;
              local_1218 = *(double *)
                            (*local_11c0 +
                            ((long)(local_11a0 - (int)local_11c0[4]) +
                             (long)(local_11a8._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] + (long)(local_a64 - (int)local_11c0[5]) * local_11c0[2]
                            + (long)local_11ac * local_11c0[3]) * 8);
              local_a78 = local_11a8._4_4_ + 1;
              local_a7c = local_11a8._0_4_ + -1;
              local_a70 = local_11c0;
              local_a74 = local_11a0;
              local_a80 = local_11ac;
              local_1220 = *(double *)
                            (*local_11c0 +
                            ((long)(local_11a0 - (int)local_11c0[4]) +
                             (long)(local_a78 - *(int *)((long)local_11c0 + 0x24)) * local_11c0[1] +
                             (long)(local_a7c - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_a94._4_4_ = local_11a8._4_4_ + 1;
              local_a88 = local_11c0;
              local_a8c = local_11a0;
              local_a94._0_4_ = (long)local_11a8._0_4_;
              local_a98 = local_11ac;
              local_1228 = *(double *)
                            (*local_11c0 +
                            ((long)(local_11a0 - (int)local_11c0[4]) +
                             (long)(local_a94._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] +
                             (long)(local_11a8._0_4_ - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_aa8 = local_11a8._4_4_ + 1;
              local_aac = local_11a8._0_4_ + 1;
              local_aa0 = local_11c0;
              local_aa4 = local_11a0;
              local_ab0 = local_11ac;
              local_1230 = *(double *)
                            (*local_11c0 +
                            ((long)(local_11a0 - (int)local_11c0[4]) +
                             (long)(local_aa8 - *(int *)((long)local_11c0 + 0x24)) * local_11c0[1] +
                             (long)(local_aac - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_db8 = local_11c8;
              local_dc8 = local_11b0;
              *(double *)
               (*local_11c8 +
               ((long)(local_11dc - (int)local_11c8[4]) +
                (long)(local_11e0 - *(int *)((long)local_11c8 + 0x24)) * local_11c8[1] +
                (long)(local_11e4 - (int)local_11c8[5]) * local_11c8[2] +
               (long)local_11b0 * local_11c8[3]) * 8) =
                   (local_1210 * 64.0 +
                    (((local_11f8 + local_1208) - local_1228) - local_1218) * 8.0 +
                   (((local_11f0 + local_1230) - local_1220) - local_1200)) * 0.015625;
              local_ddc = local_11e4 + 1;
              local_dd0 = local_11c8;
              local_de0 = local_11b0;
              *(double *)
               (*local_11c8 +
               ((long)(local_11dc - (int)local_11c8[4]) +
                (long)(local_11e0 - *(int *)((long)local_11c8 + 0x24)) * local_11c8[1] +
                (long)(local_ddc - (int)local_11c8[5]) * local_11c8[2] +
               (long)local_11b0 * local_11c8[3]) * 8) =
                   (local_1210 * 64.0 +
                    (((local_11f8 + local_1218) - local_1228) - local_1208) * 8.0 +
                   (((local_1220 + local_1200) - local_11f0) - local_1230)) * 0.015625;
              local_df0 = local_11e0 + 1;
              local_de8 = local_11c8;
              local_df8 = local_11b0;
              *(double *)
               (*local_11c8 +
               ((long)(local_11dc - (int)local_11c8[4]) +
                (long)(local_df0 - *(int *)((long)local_11c8 + 0x24)) * local_11c8[1] +
                (long)(local_11e4 - (int)local_11c8[5]) * local_11c8[2] +
               (long)local_11b0 * local_11c8[3]) * 8) =
                   (local_1210 * 64.0 +
                    (((local_1228 + local_1208) - local_11f8) - local_1218) * 8.0 +
                   (((local_1220 + local_1200) - local_11f0) - local_1230)) * 0.015625;
              local_e08 = local_11e0 + 1;
              local_e0c = local_11e4 + 1;
              local_e00 = local_11c8;
              local_e10 = local_11b0;
              *(double *)
               (*local_11c8 +
               ((long)(local_11dc - (int)local_11c8[4]) +
                (long)(local_e08 - *(int *)((long)local_11c8 + 0x24)) * local_11c8[1] +
                (long)(local_e0c - (int)local_11c8[5]) * local_11c8[2] +
               (long)local_11b0 * local_11c8[3]) * 8) =
                   (local_1210 * 64.0 +
                    (((local_1228 + local_1218) - local_11f8) - local_1208) * 8.0 +
                   (((local_11f0 + local_1230) - local_1220) - local_1200)) * 0.015625;
              local_e04 = local_11dc;
              local_df4 = local_11e4;
              local_dec = local_11dc;
              local_dd8 = local_11e0;
              local_dd4 = local_11dc;
              local_dc4 = local_11e4;
              local_dc0 = local_11e0;
              local_dbc = local_11dc;
            }
            else if (local_11b4 == 1) {
              local_910._4_4_ = local_11a0 + -1;
              local_914 = local_11a8._0_4_ + -1;
              local_908 = local_11c0;
              local_910._0_4_ = (long)local_11a8._4_4_;
              local_918 = local_11ac;
              local_1238 = *(double *)
                            (*local_11c0 +
                            ((long)(local_910._4_4_ - (int)local_11c0[4]) +
                             (long)(local_11a8._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] + (long)(local_914 - (int)local_11c0[5]) * local_11c0[2]
                            + (long)local_11ac * local_11c0[3]) * 8);
              local_92c = local_11a8._0_4_ + -1;
              local_920 = local_11c0;
              local_928._4_4_ = local_11a0;
              local_928._0_4_ = (long)local_11a8._4_4_;
              local_930 = local_11ac;
              local_1240 = *(double *)
                            (*local_11c0 +
                            ((long)(local_11a0 - (int)local_11c0[4]) +
                             (long)(local_11a8._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] + (long)(local_92c - (int)local_11c0[5]) * local_11c0[2]
                            + (long)local_11ac * local_11c0[3]) * 8);
              local_940._4_4_ = local_11a0 + 1;
              local_944 = local_11a8._0_4_ + -1;
              local_938 = local_11c0;
              local_940._0_4_ = (long)local_11a8._4_4_;
              local_948 = local_11ac;
              local_1248 = *(double *)
                            (*local_11c0 +
                            ((long)(local_940._4_4_ - (int)local_11c0[4]) +
                             (long)(local_11a8._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] + (long)(local_944 - (int)local_11c0[5]) * local_11c0[2]
                            + (long)local_11ac * local_11c0[3]) * 8);
              local_954 = local_11a0 + -1;
              local_950 = local_11c0;
              local_95c._4_4_ = local_11a8._4_4_;
              local_95c._0_4_ = local_11a8._0_4_;
              local_960 = local_11ac;
              local_1250 = *(double *)
                            (*local_11c0 +
                            ((long)(local_954 - (int)local_11c0[4]) +
                             (long)(local_11a8._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] +
                             (long)(local_11a8._0_4_ - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_968 = local_11c0;
              local_96c = local_11a0;
              local_974._4_4_ = local_11a8._4_4_;
              local_974._0_4_ = local_11a8._0_4_;
              local_978 = local_11ac;
              local_1258 = *(double *)
                            (*local_11c0 +
                            ((long)(local_11a0 - (int)local_11c0[4]) +
                             (long)(local_11a8._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] +
                             (long)(local_11a8._0_4_ - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_984 = local_11a0 + 1;
              local_980 = local_11c0;
              local_98c._4_4_ = local_11a8._4_4_;
              local_98c._0_4_ = local_11a8._0_4_;
              local_990 = local_11ac;
              local_1260 = *(double *)
                            (*local_11c0 +
                            ((long)(local_984 - (int)local_11c0[4]) +
                             (long)(local_11a8._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] +
                             (long)(local_11a8._0_4_ - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_9a0._4_4_ = local_11a0 + -1;
              local_9a4 = local_11a8._0_4_ + 1;
              local_998 = local_11c0;
              local_9a0._0_4_ = (long)local_11a8._4_4_;
              local_9a8 = local_11ac;
              local_1268 = *(double *)
                            (*local_11c0 +
                            ((long)(local_9a0._4_4_ - (int)local_11c0[4]) +
                             (long)(local_11a8._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] + (long)(local_9a4 - (int)local_11c0[5]) * local_11c0[2]
                            + (long)local_11ac * local_11c0[3]) * 8);
              local_9bc = local_11a8._0_4_ + 1;
              local_9b0 = local_11c0;
              local_9b8._4_4_ = local_11a0;
              local_9b8._0_4_ = (long)local_11a8._4_4_;
              local_9c0 = local_11ac;
              local_1270 = *(double *)
                            (*local_11c0 +
                            ((long)(local_11a0 - (int)local_11c0[4]) +
                             (long)(local_11a8._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] + (long)(local_9bc - (int)local_11c0[5]) * local_11c0[2]
                            + (long)local_11ac * local_11c0[3]) * 8);
              local_9d0._4_4_ = local_11a0 + 1;
              local_9d4 = local_11a8._0_4_ + 1;
              local_9c8 = local_11c0;
              local_9d0._0_4_ = (long)local_11a8._4_4_;
              local_9d8 = local_11ac;
              local_1278 = *(double *)
                            (*local_11c0 +
                            ((long)(local_9d0._4_4_ - (int)local_11c0[4]) +
                             (long)(local_11a8._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] + (long)(local_9d4 - (int)local_11c0[5]) * local_11c0[2]
                            + (long)local_11ac * local_11c0[3]) * 8);
              local_d58 = local_11c8;
              local_d68 = local_11b0;
              *(double *)
               (*local_11c8 +
               ((long)(local_11dc - (int)local_11c8[4]) +
                (long)(local_11e0 - *(int *)((long)local_11c8 + 0x24)) * local_11c8[1] +
                (long)(local_11e4 - (int)local_11c8[5]) * local_11c8[2] +
               (long)local_11b0 * local_11c8[3]) * 8) =
                   (local_1258 * 64.0 +
                    (((local_1240 + local_1250) - local_1270) - local_1260) * 8.0 +
                   (((local_1238 + local_1278) - local_1268) - local_1248)) * 0.015625;
              local_d74 = local_11dc + 1;
              local_d70 = local_11c8;
              local_d80 = local_11b0;
              *(double *)
               (*local_11c8 +
               ((long)(local_d74 - (int)local_11c8[4]) +
                (long)(local_11e0 - *(int *)((long)local_11c8 + 0x24)) * local_11c8[1] +
                (long)(local_11e4 - (int)local_11c8[5]) * local_11c8[2] +
               (long)local_11b0 * local_11c8[3]) * 8) =
                   (local_1258 * 64.0 +
                    (((local_1240 + local_1260) - local_1270) - local_1250) * 8.0 +
                   (((local_1268 + local_1248) - local_1238) - local_1278)) * 0.015625;
              local_d94 = local_11e4 + 1;
              local_d88 = local_11c8;
              local_d98 = local_11b0;
              *(double *)
               (*local_11c8 +
               ((long)(local_11dc - (int)local_11c8[4]) +
                (long)(local_11e0 - *(int *)((long)local_11c8 + 0x24)) * local_11c8[1] +
                (long)(local_d94 - (int)local_11c8[5]) * local_11c8[2] +
               (long)local_11b0 * local_11c8[3]) * 8) =
                   (local_1258 * 64.0 +
                    (((local_1270 + local_1250) - local_1240) - local_1260) * 8.0 +
                   (((local_1268 + local_1248) - local_1238) - local_1278)) * 0.015625;
              local_da4 = local_11dc + 1;
              local_dac = local_11e4 + 1;
              local_da0 = local_11c8;
              local_db0 = local_11b0;
              *(double *)
               (*local_11c8 +
               ((long)(local_da4 - (int)local_11c8[4]) +
                (long)(local_11e0 - *(int *)((long)local_11c8 + 0x24)) * local_11c8[1] +
                (long)(local_dac - (int)local_11c8[5]) * local_11c8[2] +
               (long)local_11b0 * local_11c8[3]) * 8) =
                   (local_1258 * 64.0 +
                    (((local_1270 + local_1260) - local_1240) - local_1250) * 8.0 +
                   (((local_1238 + local_1278) - local_1268) - local_1248)) * 0.015625;
              local_da8 = local_11e0;
              local_d90 = local_11e0;
              local_d8c = local_11dc;
              local_d7c = local_11e4;
              local_d78 = local_11e0;
              local_d64 = local_11e4;
              local_d60 = local_11e0;
              local_d5c = local_11dc;
            }
            else if (local_11b4 == 2) {
              local_834 = local_11a0 + -1;
              local_83c._4_4_ = local_11a8._4_4_ + -1;
              local_830 = local_11c0;
              local_83c._0_4_ = (long)local_11a8._0_4_;
              local_840 = local_11ac;
              local_1280 = *(double *)
                            (*local_11c0 +
                            ((long)(local_834 - (int)local_11c0[4]) +
                             (long)(local_83c._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] +
                             (long)(local_11a8._0_4_ - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_854._4_4_ = local_11a8._4_4_ + -1;
              local_848 = local_11c0;
              local_84c = local_11a0;
              local_854._0_4_ = (long)local_11a8._0_4_;
              local_858 = local_11ac;
              local_1288 = *(double *)
                            (*local_11c0 +
                            ((long)(local_11a0 - (int)local_11c0[4]) +
                             (long)(local_854._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] +
                             (long)(local_11a8._0_4_ - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_864 = local_11a0 + 1;
              local_86c._4_4_ = local_11a8._4_4_ + -1;
              local_860 = local_11c0;
              local_86c._0_4_ = (long)local_11a8._0_4_;
              local_870 = local_11ac;
              local_1290 = *(double *)
                            (*local_11c0 +
                            ((long)(local_864 - (int)local_11c0[4]) +
                             (long)(local_86c._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] +
                             (long)(local_11a8._0_4_ - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_87c = local_11a0 + -1;
              local_878 = local_11c0;
              local_884._4_4_ = local_11a8._4_4_;
              local_884._0_4_ = local_11a8._0_4_;
              local_888 = local_11ac;
              local_1298 = *(double *)
                            (*local_11c0 +
                            ((long)(local_87c - (int)local_11c0[4]) +
                             (long)(local_11a8._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] +
                             (long)(local_11a8._0_4_ - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_890 = local_11c0;
              local_894 = local_11a0;
              local_89c._4_4_ = local_11a8._4_4_;
              local_89c._0_4_ = local_11a8._0_4_;
              local_8a0 = local_11ac;
              local_12a0 = *(double *)
                            (*local_11c0 +
                            ((long)(local_11a0 - (int)local_11c0[4]) +
                             (long)(local_11a8._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] +
                             (long)(local_11a8._0_4_ - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_8ac = local_11a0 + 1;
              local_8a8 = local_11c0;
              local_8b4._4_4_ = local_11a8._4_4_;
              local_8b4._0_4_ = local_11a8._0_4_;
              local_8b8 = local_11ac;
              local_12a8 = *(double *)
                            (*local_11c0 +
                            ((long)(local_8ac - (int)local_11c0[4]) +
                             (long)(local_11a8._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] +
                             (long)(local_11a8._0_4_ - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_8c4 = local_11a0 + -1;
              local_8cc._4_4_ = local_11a8._4_4_ + 1;
              local_8c0 = local_11c0;
              local_8cc._0_4_ = (long)local_11a8._0_4_;
              local_8d0 = local_11ac;
              local_12b0 = *(double *)
                            (*local_11c0 +
                            ((long)(local_8c4 - (int)local_11c0[4]) +
                             (long)(local_8cc._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] +
                             (long)(local_11a8._0_4_ - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_8e4._4_4_ = local_11a8._4_4_ + 1;
              local_8d8 = local_11c0;
              local_8dc = local_11a0;
              local_8e4._0_4_ = (long)local_11a8._0_4_;
              local_8e8 = local_11ac;
              local_12b8 = *(double *)
                            (*local_11c0 +
                            ((long)(local_11a0 - (int)local_11c0[4]) +
                             (long)(local_8e4._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] +
                             (long)(local_11a8._0_4_ - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_8f4 = local_11a0 + 1;
              local_8fc._4_4_ = local_11a8._4_4_ + 1;
              local_8f0 = local_11c0;
              local_8fc._0_4_ = (long)local_11a8._0_4_;
              local_900 = local_11ac;
              local_12c0 = *(double *)
                            (*local_11c0 +
                            ((long)(local_8f4 - (int)local_11c0[4]) +
                             (long)(local_8fc._4_4_ - *(int *)((long)local_11c0 + 0x24)) *
                             local_11c0[1] +
                             (long)(local_11a8._0_4_ - (int)local_11c0[5]) * local_11c0[2] +
                            (long)local_11ac * local_11c0[3]) * 8);
              local_cf8 = local_11c8;
              local_d08 = local_11b0;
              *(double *)
               (*local_11c8 +
               ((long)(local_11dc - (int)local_11c8[4]) +
                (long)(local_11e0 - *(int *)((long)local_11c8 + 0x24)) * local_11c8[1] +
                (long)(local_11e4 - (int)local_11c8[5]) * local_11c8[2] +
               (long)local_11b0 * local_11c8[3]) * 8) =
                   (local_12a0 * 64.0 +
                    (((local_1288 + local_1298) - local_12b8) - local_12a8) * 8.0 +
                   (((local_1280 + local_12c0) - local_12b0) - local_1290)) * 0.015625;
              local_d14 = local_11dc + 1;
              local_d10 = local_11c8;
              local_d20 = local_11b0;
              *(double *)
               (*local_11c8 +
               ((long)(local_d14 - (int)local_11c8[4]) +
                (long)(local_11e0 - *(int *)((long)local_11c8 + 0x24)) * local_11c8[1] +
                (long)(local_11e4 - (int)local_11c8[5]) * local_11c8[2] +
               (long)local_11b0 * local_11c8[3]) * 8) =
                   (local_12a0 * 64.0 +
                    (((local_1288 + local_12a8) - local_12b8) - local_1298) * 8.0 +
                   (((local_12b0 + local_1290) - local_1280) - local_12c0)) * 0.015625;
              local_d30 = local_11e0 + 1;
              local_d28 = local_11c8;
              local_d38 = local_11b0;
              *(double *)
               (*local_11c8 +
               ((long)(local_11dc - (int)local_11c8[4]) +
                (long)(local_d30 - *(int *)((long)local_11c8 + 0x24)) * local_11c8[1] +
                (long)(local_11e4 - (int)local_11c8[5]) * local_11c8[2] +
               (long)local_11b0 * local_11c8[3]) * 8) =
                   (local_12a0 * 64.0 +
                    (((local_12b8 + local_1298) - local_1288) - local_12a8) * 8.0 +
                   (((local_12b0 + local_1290) - local_1280) - local_12c0)) * 0.015625;
              local_d44 = local_11dc + 1;
              local_d48 = local_11e0 + 1;
              local_d40 = local_11c8;
              local_d50 = local_11b0;
              *(double *)
               (*local_11c8 +
               ((long)(local_d44 - (int)local_11c8[4]) +
                (long)(local_d48 - *(int *)((long)local_11c8 + 0x24)) * local_11c8[1] +
                (long)(local_11e4 - (int)local_11c8[5]) * local_11c8[2] +
               (long)local_11b0 * local_11c8[3]) * 8) =
                   (local_12a0 * 64.0 +
                    (((local_12b8 + local_12a8) - local_1288) - local_1298) * 8.0 +
                   (((local_1280 + local_12c0) - local_12b0) - local_1290)) * 0.015625;
              local_d4c = local_11e4;
              local_d34 = local_11e4;
              local_d2c = local_11dc;
              local_d1c = local_11e4;
              local_d18 = local_11e0;
              local_d04 = local_11e4;
              local_d00 = local_11e0;
              local_cfc = local_11dc;
            }
          }
        }
      }
    }
    local_1dd0._4_4_ = local_1dd0._4_4_ + 1;
    unique0x10007510 = local_1d84;
    auVar5 = local_1d7c;
    local_1d84._4_4_ = iVar11;
    local_1d7c._4_4_ = uVar14;
  } while( true );
}

Assistant:

void
FaceDivFree::interp_arr (Array<FArrayBox*, AMREX_SPACEDIM> const& crse,
                         const int         crse_comp,
                         Array<FArrayBox*, AMREX_SPACEDIM> const& fine,
                         const int         fine_comp,
                         const int         ncomp,
                         const Box&        fine_region,
                         const IntVect&    ratio,
                         Array<IArrayBox*, AMREX_SPACEDIM> const& solve_mask,
                         const Geometry&   /*crse_geom */,
                         const Geometry&   fine_geom,
                         Vector<Array<BCRec, AMREX_SPACEDIM> > const& /*bcr*/,
                         const int         /*actual_comp*/,
                         const int         /*actual_state*/,
                         const RunOn       runon)
{
    BL_PROFILE("FaceDivFree::interp()");

    Array<IndexType, AMREX_SPACEDIM> types;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
        { types[d].set(d); }

    // This is currently only designed for octree, where ratio = 2.
    AMREX_ALWAYS_ASSERT(ratio == 2);

    const Box c_fine_region = amrex::coarsen(fine_region, ratio);
    GpuArray<Real, AMREX_SPACEDIM> cell_size = fine_geom.CellSizeArray();

    GpuArray<Array4<const Real>, AMREX_SPACEDIM> crsearr;
    GpuArray<Array4<Real>, AMREX_SPACEDIM> finearr;
    GpuArray<Array4<const int>, AMREX_SPACEDIM> maskarr;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
    {
        crsearr[d] = crse[d]->const_array(crse_comp);
        finearr[d] = fine[d]->array(fine_comp);
        if (solve_mask[d] != nullptr)
            { maskarr[d] = solve_mask[d]->const_array(0); }
    }

    // Fuse the launches, 1 for each dimension, into a single launch.
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM_FLAG(runon,
              amrex::convert(c_fine_region,types[0]), bx0,
              {
                  AMREX_LOOP_3D(bx0, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          amrex::facediv_face_interp<Real> (i,j,k,crse_comp+n,fine_comp+n, 0,
                                                            crsearr[0], finearr[0], maskarr[0], ratio);
                      }
                  });
              },
              amrex::convert(c_fine_region,types[1]), bx1,
              {
                  AMREX_LOOP_3D(bx1, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          amrex::facediv_face_interp<Real> (i,j,k,crse_comp+n,fine_comp+n, 1,
                                                            crsearr[1], finearr[1], maskarr[1], ratio);
                      }
                  });
              },
              amrex::convert(c_fine_region,types[2]), bx2,
              {
                  AMREX_LOOP_3D(bx2, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          amrex::facediv_face_interp<Real> (i,j,k,crse_comp+n,fine_comp+n, 2,
                                                            crsearr[2], finearr[2], maskarr[2], ratio);
                      }
                  });
              });

    AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,c_fine_region,ncomp,i,j,k,n,
    {
        amrex::facediv_int<Real>(i, j, k, fine_comp+n, finearr, ratio, cell_size);
    });
}